

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx512::CurveNiIntersectorK<8,4>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float fVar1;
  BBox1f BVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  RTCFilterFunctionN p_Var10;
  void *pvVar11;
  __int_type_conflict _Var12;
  undefined1 auVar13 [16];
  undefined8 uVar14;
  undefined8 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  bool bVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  byte bVar27;
  uint uVar28;
  ulong uVar29;
  long lVar30;
  uint uVar31;
  ulong uVar32;
  undefined8 unaff_RBP;
  ulong uVar33;
  ulong uVar34;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar112 [32];
  undefined1 auVar114 [32];
  undefined1 auVar116 [32];
  undefined1 auVar118 [32];
  undefined1 auVar120 [32];
  float fVar122;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  float fVar127;
  float fVar128;
  float t1;
  undefined4 uVar129;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar148;
  float fVar153;
  float fVar154;
  float fVar155;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  vfloat4 b0;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  vfloat4 b0_1;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  vfloat4 a0_2;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  float fVar195;
  float fVar203;
  float fVar204;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar205;
  float fVar206;
  float fVar214;
  float fVar215;
  vfloat4 a0_1;
  float fVar216;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar217;
  float fVar224;
  float fVar225;
  vfloat4 a0;
  float fVar226;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [64];
  undefined1 auVar237 [64];
  undefined1 auVar238 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 in_ZMM30 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  undefined1 local_358 [16];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  RTCHitN local_108 [16];
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 local_78 [32];
  BBox1f cv_stack [4];
  undefined1 auVar111 [32];
  undefined1 auVar113 [32];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar119 [32];
  undefined1 auVar121 [32];
  
  uVar29 = (ulong)(byte)prim[1];
  fVar1 = *(float *)(prim + uVar29 * 0x19 + 0x12);
  auVar13 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar13 = vinsertps_avx(auVar13,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar39 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar80 = vinsertps_avx(auVar39,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar40 = vsubps_avx(auVar13,*(undefined1 (*) [16])(prim + uVar29 * 0x19 + 6));
  fVar138 = fVar1 * auVar40._0_4_;
  fVar122 = fVar1 * auVar80._0_4_;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar29 * 4 + 6);
  auVar94 = vpmovsxbd_avx2(auVar13);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar29 * 5 + 6);
  auVar91 = vpmovsxbd_avx2(auVar39);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar29 * 6 + 6);
  auVar92 = vpmovsxbd_avx2(auVar47);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar29 * 0xb + 6);
  auVar105 = vpmovsxbd_avx2(auVar46);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar29 * 0xc + 6);
  auVar95 = vpmovsxbd_avx2(auVar45);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar29 * 0xd + 6);
  auVar93 = vpmovsxbd_avx2(auVar58);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar29 * 0x12 + 6);
  auVar106 = vpmovsxbd_avx2(auVar5);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar29 * 0x13 + 6);
  auVar98 = vpmovsxbd_avx2(auVar44);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar96 = vcvtdq2ps_avx(auVar98);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar29 * 0x14 + 6);
  auVar89 = vpmovsxbd_avx2(auVar43);
  auVar97 = vcvtdq2ps_avx(auVar89);
  auVar108._4_4_ = fVar122;
  auVar108._0_4_ = fVar122;
  auVar108._8_4_ = fVar122;
  auVar108._12_4_ = fVar122;
  auVar108._16_4_ = fVar122;
  auVar108._20_4_ = fVar122;
  auVar108._24_4_ = fVar122;
  auVar108._28_4_ = fVar122;
  auVar151._8_4_ = 1;
  auVar151._0_8_ = 0x100000001;
  auVar151._12_4_ = 1;
  auVar151._16_4_ = 1;
  auVar151._20_4_ = 1;
  auVar151._24_4_ = 1;
  auVar151._28_4_ = 1;
  auVar99 = ZEXT1632(CONCAT412(fVar1 * auVar80._12_4_,
                               CONCAT48(fVar1 * auVar80._8_4_,
                                        CONCAT44(fVar1 * auVar80._4_4_,fVar122))));
  auVar90 = vpermps_avx2(auVar151,auVar99);
  auVar87 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar243 = ZEXT3264(auVar87);
  auVar88 = vpermps_avx512vl(auVar87,auVar99);
  fVar122 = auVar88._0_4_;
  fVar205 = auVar88._4_4_;
  auVar99._4_4_ = fVar205 * auVar92._4_4_;
  auVar99._0_4_ = fVar122 * auVar92._0_4_;
  fVar195 = auVar88._8_4_;
  auVar99._8_4_ = fVar195 * auVar92._8_4_;
  fVar203 = auVar88._12_4_;
  auVar99._12_4_ = fVar203 * auVar92._12_4_;
  fVar204 = auVar88._16_4_;
  auVar99._16_4_ = fVar204 * auVar92._16_4_;
  fVar127 = auVar88._20_4_;
  auVar99._20_4_ = fVar127 * auVar92._20_4_;
  fVar128 = auVar88._24_4_;
  auVar99._24_4_ = fVar128 * auVar92._24_4_;
  auVar99._28_4_ = auVar98._28_4_;
  auVar98._4_4_ = auVar93._4_4_ * fVar205;
  auVar98._0_4_ = auVar93._0_4_ * fVar122;
  auVar98._8_4_ = auVar93._8_4_ * fVar195;
  auVar98._12_4_ = auVar93._12_4_ * fVar203;
  auVar98._16_4_ = auVar93._16_4_ * fVar204;
  auVar98._20_4_ = auVar93._20_4_ * fVar127;
  auVar98._24_4_ = auVar93._24_4_ * fVar128;
  auVar98._28_4_ = auVar89._28_4_;
  auVar89._4_4_ = auVar97._4_4_ * fVar205;
  auVar89._0_4_ = auVar97._0_4_ * fVar122;
  auVar89._8_4_ = auVar97._8_4_ * fVar195;
  auVar89._12_4_ = auVar97._12_4_ * fVar203;
  auVar89._16_4_ = auVar97._16_4_ * fVar204;
  auVar89._20_4_ = auVar97._20_4_ * fVar127;
  auVar89._24_4_ = auVar97._24_4_ * fVar128;
  auVar89._28_4_ = auVar88._28_4_;
  auVar13 = vfmadd231ps_fma(auVar99,auVar90,auVar91);
  auVar39 = vfmadd231ps_fma(auVar98,auVar90,auVar95);
  auVar47 = vfmadd231ps_fma(auVar89,auVar96,auVar90);
  auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar108,auVar94);
  auVar39 = vfmadd231ps_fma(ZEXT1632(auVar39),auVar108,auVar105);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar106,auVar108);
  auVar109._4_4_ = fVar138;
  auVar109._0_4_ = fVar138;
  auVar109._8_4_ = fVar138;
  auVar109._12_4_ = fVar138;
  auVar109._16_4_ = fVar138;
  auVar109._20_4_ = fVar138;
  auVar109._24_4_ = fVar138;
  auVar109._28_4_ = fVar138;
  auVar89 = ZEXT1632(CONCAT412(fVar1 * auVar40._12_4_,
                               CONCAT48(fVar1 * auVar40._8_4_,
                                        CONCAT44(fVar1 * auVar40._4_4_,fVar138))));
  auVar98 = vpermps_avx2(auVar151,auVar89);
  auVar89 = vpermps_avx512vl(auVar87,auVar89);
  auVar90 = vmulps_avx512vl(auVar89,auVar92);
  auVar101._0_4_ = auVar89._0_4_ * auVar93._0_4_;
  auVar101._4_4_ = auVar89._4_4_ * auVar93._4_4_;
  auVar101._8_4_ = auVar89._8_4_ * auVar93._8_4_;
  auVar101._12_4_ = auVar89._12_4_ * auVar93._12_4_;
  auVar101._16_4_ = auVar89._16_4_ * auVar93._16_4_;
  auVar101._20_4_ = auVar89._20_4_ * auVar93._20_4_;
  auVar101._24_4_ = auVar89._24_4_ * auVar93._24_4_;
  auVar101._28_4_ = 0;
  auVar93._4_4_ = auVar89._4_4_ * auVar97._4_4_;
  auVar93._0_4_ = auVar89._0_4_ * auVar97._0_4_;
  auVar93._8_4_ = auVar89._8_4_ * auVar97._8_4_;
  auVar93._12_4_ = auVar89._12_4_ * auVar97._12_4_;
  auVar93._16_4_ = auVar89._16_4_ * auVar97._16_4_;
  auVar93._20_4_ = auVar89._20_4_ * auVar97._20_4_;
  auVar93._24_4_ = auVar89._24_4_ * auVar97._24_4_;
  auVar93._28_4_ = auVar92._28_4_;
  auVar91 = vfmadd231ps_avx512vl(auVar90,auVar98,auVar91);
  auVar46 = vfmadd231ps_fma(auVar101,auVar98,auVar95);
  auVar45 = vfmadd231ps_fma(auVar93,auVar98,auVar96);
  auVar91 = vfmadd231ps_avx512vl(auVar91,auVar109,auVar94);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar109,auVar105);
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar109,auVar106);
  auVar103._8_4_ = 0x7fffffff;
  auVar103._0_8_ = 0x7fffffff7fffffff;
  auVar103._12_4_ = 0x7fffffff;
  auVar103._16_4_ = 0x7fffffff;
  auVar103._20_4_ = 0x7fffffff;
  auVar103._24_4_ = 0x7fffffff;
  auVar103._28_4_ = 0x7fffffff;
  auVar94 = vandps_avx(ZEXT1632(auVar13),auVar103);
  auVar107._8_4_ = 0x219392ef;
  auVar107._0_8_ = 0x219392ef219392ef;
  auVar107._12_4_ = 0x219392ef;
  auVar107._16_4_ = 0x219392ef;
  auVar107._20_4_ = 0x219392ef;
  auVar107._24_4_ = 0x219392ef;
  auVar107._28_4_ = 0x219392ef;
  uVar33 = vcmpps_avx512vl(auVar94,auVar107,1);
  bVar37 = (bool)((byte)uVar33 & 1);
  auVar90._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar13._0_4_;
  bVar37 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar13._4_4_;
  bVar37 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar13._8_4_;
  bVar37 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar13._12_4_;
  auVar90._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar90._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar90._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar90._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(ZEXT1632(auVar39),auVar103);
  uVar33 = vcmpps_avx512vl(auVar94,auVar107,1);
  bVar37 = (bool)((byte)uVar33 & 1);
  auVar87._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar39._0_4_;
  bVar37 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar39._4_4_;
  bVar37 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar39._8_4_;
  bVar37 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar39._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar94 = vandps_avx(ZEXT1632(auVar47),auVar103);
  uVar33 = vcmpps_avx512vl(auVar94,auVar107,1);
  bVar37 = (bool)((byte)uVar33 & 1);
  auVar94._0_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar47._0_4_;
  bVar37 = (bool)((byte)(uVar33 >> 1) & 1);
  auVar94._4_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar47._4_4_;
  bVar37 = (bool)((byte)(uVar33 >> 2) & 1);
  auVar94._8_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar47._8_4_;
  bVar37 = (bool)((byte)(uVar33 >> 3) & 1);
  auVar94._12_4_ = (uint)bVar37 * 0x219392ef | (uint)!bVar37 * auVar47._12_4_;
  auVar94._16_4_ = (uint)((byte)(uVar33 >> 4) & 1) * 0x219392ef;
  auVar94._20_4_ = (uint)((byte)(uVar33 >> 5) & 1) * 0x219392ef;
  auVar94._24_4_ = (uint)((byte)(uVar33 >> 6) & 1) * 0x219392ef;
  auVar94._28_4_ = (uint)(byte)(uVar33 >> 7) * 0x219392ef;
  auVar92 = vrcp14ps_avx512vl(auVar90);
  auVar104._8_4_ = 0x3f800000;
  auVar104._0_8_ = 0x3f8000003f800000;
  auVar104._12_4_ = 0x3f800000;
  auVar104._16_4_ = 0x3f800000;
  auVar104._20_4_ = 0x3f800000;
  auVar104._24_4_ = 0x3f800000;
  auVar104._28_4_ = 0x3f800000;
  auVar13 = vfnmadd213ps_fma(auVar90,auVar92,auVar104);
  auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar87);
  auVar39 = vfnmadd213ps_fma(auVar87,auVar92,auVar104);
  auVar39 = vfmadd132ps_fma(ZEXT1632(auVar39),auVar92,auVar92);
  auVar92 = vrcp14ps_avx512vl(auVar94);
  auVar47 = vfnmadd213ps_fma(auVar94,auVar92,auVar104);
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 7 + 6));
  auVar47 = vfmadd132ps_fma(ZEXT1632(auVar47),auVar92,auVar92);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar92 = vsubps_avx512vl(auVar94,auVar91);
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 9 + 6));
  auVar106._4_4_ = auVar13._4_4_ * auVar92._4_4_;
  auVar106._0_4_ = auVar13._0_4_ * auVar92._0_4_;
  auVar106._8_4_ = auVar13._8_4_ * auVar92._8_4_;
  auVar106._12_4_ = auVar13._12_4_ * auVar92._12_4_;
  auVar106._16_4_ = auVar92._16_4_ * 0.0;
  auVar106._20_4_ = auVar92._20_4_ * 0.0;
  auVar106._24_4_ = auVar92._24_4_ * 0.0;
  auVar106._28_4_ = auVar92._28_4_;
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar91 = vsubps_avx512vl(auVar94,auVar91);
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 0xe + 6));
  auVar102._0_4_ = auVar13._0_4_ * auVar91._0_4_;
  auVar102._4_4_ = auVar13._4_4_ * auVar91._4_4_;
  auVar102._8_4_ = auVar13._8_4_ * auVar91._8_4_;
  auVar102._12_4_ = auVar13._12_4_ * auVar91._12_4_;
  auVar102._16_4_ = auVar91._16_4_ * 0.0;
  auVar102._20_4_ = auVar91._20_4_ * 0.0;
  auVar102._24_4_ = auVar91._24_4_ * 0.0;
  auVar102._28_4_ = 0;
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar46));
  auVar96._4_4_ = auVar39._4_4_ * auVar94._4_4_;
  auVar96._0_4_ = auVar39._0_4_ * auVar94._0_4_;
  auVar96._8_4_ = auVar39._8_4_ * auVar94._8_4_;
  auVar96._12_4_ = auVar39._12_4_ * auVar94._12_4_;
  auVar96._16_4_ = auVar94._16_4_ * 0.0;
  auVar96._20_4_ = auVar94._20_4_ * 0.0;
  auVar96._24_4_ = auVar94._24_4_ * 0.0;
  auVar96._28_4_ = auVar94._28_4_;
  auVar93 = vpbroadcastd_avx512vl();
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar46));
  auVar100._0_4_ = auVar39._0_4_ * auVar94._0_4_;
  auVar100._4_4_ = auVar39._4_4_ * auVar94._4_4_;
  auVar100._8_4_ = auVar39._8_4_ * auVar94._8_4_;
  auVar100._12_4_ = auVar39._12_4_ * auVar94._12_4_;
  auVar100._16_4_ = auVar94._16_4_ * 0.0;
  auVar100._20_4_ = auVar94._20_4_ * 0.0;
  auVar100._24_4_ = auVar94._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 0x15 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar45));
  auVar97._4_4_ = auVar94._4_4_ * auVar47._4_4_;
  auVar97._0_4_ = auVar94._0_4_ * auVar47._0_4_;
  auVar97._8_4_ = auVar94._8_4_ * auVar47._8_4_;
  auVar97._12_4_ = auVar94._12_4_ * auVar47._12_4_;
  auVar97._16_4_ = auVar94._16_4_ * 0.0;
  auVar97._20_4_ = auVar94._20_4_ * 0.0;
  auVar97._24_4_ = auVar94._24_4_ * 0.0;
  auVar97._28_4_ = auVar94._28_4_;
  auVar94 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar29 * 0x17 + 6));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar94 = vsubps_avx(auVar94,ZEXT1632(auVar45));
  auVar88._0_4_ = auVar47._0_4_ * auVar94._0_4_;
  auVar88._4_4_ = auVar47._4_4_ * auVar94._4_4_;
  auVar88._8_4_ = auVar47._8_4_ * auVar94._8_4_;
  auVar88._12_4_ = auVar47._12_4_ * auVar94._12_4_;
  auVar88._16_4_ = auVar94._16_4_ * 0.0;
  auVar88._20_4_ = auVar94._20_4_ * 0.0;
  auVar88._24_4_ = auVar94._24_4_ * 0.0;
  auVar88._28_4_ = 0;
  auVar94 = vpminsd_avx2(auVar106,auVar102);
  auVar91 = vpminsd_avx2(auVar96,auVar100);
  auVar94 = vmaxps_avx(auVar94,auVar91);
  auVar91 = vpminsd_avx2(auVar97,auVar88);
  uVar129 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar92._4_4_ = uVar129;
  auVar92._0_4_ = uVar129;
  auVar92._8_4_ = uVar129;
  auVar92._12_4_ = uVar129;
  auVar92._16_4_ = uVar129;
  auVar92._20_4_ = uVar129;
  auVar92._24_4_ = uVar129;
  auVar92._28_4_ = uVar129;
  auVar91 = vmaxps_avx512vl(auVar91,auVar92);
  auVar94 = vmaxps_avx(auVar94,auVar91);
  auVar91._8_4_ = 0x3f7ffffa;
  auVar91._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar91._12_4_ = 0x3f7ffffa;
  auVar91._16_4_ = 0x3f7ffffa;
  auVar91._20_4_ = 0x3f7ffffa;
  auVar91._24_4_ = 0x3f7ffffa;
  auVar91._28_4_ = 0x3f7ffffa;
  local_78 = vmulps_avx512vl(auVar94,auVar91);
  auVar94 = vpmaxsd_avx2(auVar106,auVar102);
  auVar91 = vpmaxsd_avx2(auVar96,auVar100);
  auVar94 = vminps_avx(auVar94,auVar91);
  auVar91 = vpmaxsd_avx2(auVar97,auVar88);
  uVar129 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar105._4_4_ = uVar129;
  auVar105._0_4_ = uVar129;
  auVar105._8_4_ = uVar129;
  auVar105._12_4_ = uVar129;
  auVar105._16_4_ = uVar129;
  auVar105._20_4_ = uVar129;
  auVar105._24_4_ = uVar129;
  auVar105._28_4_ = uVar129;
  auVar91 = vminps_avx512vl(auVar91,auVar105);
  auVar94 = vminps_avx(auVar94,auVar91);
  auVar95._8_4_ = 0x3f800003;
  auVar95._0_8_ = 0x3f8000033f800003;
  auVar95._12_4_ = 0x3f800003;
  auVar95._16_4_ = 0x3f800003;
  auVar95._20_4_ = 0x3f800003;
  auVar95._24_4_ = 0x3f800003;
  auVar95._28_4_ = 0x3f800003;
  auVar94 = vmulps_avx512vl(auVar94,auVar95);
  uVar14 = vcmpps_avx512vl(local_78,auVar94,2);
  uVar15 = vpcmpgtd_avx512vl(auVar93,_DAT_01fb4ba0);
  uVar33 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),(uint)(byte)((byte)uVar14 & (byte)uVar15));
  auVar13 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar236 = ZEXT1664(auVar39);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar237 = ZEXT1664(auVar39);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar238 = ZEXT1664(auVar39);
  auVar245 = ZEXT464(0x3f800000);
  auVar39 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar244 = ZEXT1664(auVar39);
LAB_019c206c:
  if (uVar33 == 0) {
    return;
  }
  lVar30 = 0;
  for (uVar29 = uVar33; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
    lVar30 = lVar30 + 1;
  }
  uVar6 = *(uint *)(prim + 2);
  uVar7 = *(uint *)(prim + lVar30 * 4 + 6);
  pGVar9 = (context->scene->geometries).items[uVar6].ptr;
  uVar29 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar7);
  p_Var10 = pGVar9[1].intersectionFilterN;
  pvVar11 = pGVar9[2].userPtr;
  _Var12 = pGVar9[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar39 = *(undefined1 (*) [16])(_Var12 + uVar29 * (long)pvVar11);
  auVar47 = *(undefined1 (*) [16])(_Var12 + (uVar29 + 1) * (long)pvVar11);
  auVar46 = *(undefined1 (*) [16])(_Var12 + (uVar29 + 2) * (long)pvVar11);
  auVar45 = *(undefined1 (*) [16])(_Var12 + (long)pvVar11 * (uVar29 + 3));
  lVar30 = *(long *)&pGVar9[1].time_range.upper;
  auVar58 = *(undefined1 (*) [16])(lVar30 + (long)p_Var10 * uVar29);
  auVar5 = *(undefined1 (*) [16])(lVar30 + (long)p_Var10 * (uVar29 + 1));
  auVar44 = *(undefined1 (*) [16])(lVar30 + (long)p_Var10 * (uVar29 + 2));
  uVar33 = uVar33 - 1 & uVar33;
  auVar43 = *(undefined1 (*) [16])(lVar30 + (long)p_Var10 * (uVar29 + 3));
  if (uVar33 != 0) {
    uVar34 = uVar33 - 1 & uVar33;
    for (uVar29 = uVar33; (uVar29 & 1) == 0; uVar29 = uVar29 >> 1 | 0x8000000000000000) {
    }
    if (uVar34 != 0) {
      for (; (uVar34 & 1) == 0; uVar34 = uVar34 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar80 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar80 = vinsertps_avx(auVar80,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar1 = *(float *)(ray + k * 4 + 0x30);
  auVar59 = ZEXT816(0) << 0x40;
  auVar40._0_4_ = auVar43._0_4_ * 0.0;
  auVar40._4_4_ = auVar43._4_4_ * 0.0;
  auVar40._8_4_ = auVar43._8_4_ * 0.0;
  auVar40._12_4_ = auVar43._12_4_ * 0.0;
  auVar42 = vfmadd231ps_fma(auVar40,auVar44,auVar59);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar5,auVar42);
  auVar61._0_4_ = auVar58._0_4_ + auVar40._0_4_;
  auVar61._4_4_ = auVar58._4_4_ + auVar40._4_4_;
  auVar61._8_4_ = auVar58._8_4_ + auVar40._8_4_;
  auVar61._12_4_ = auVar58._12_4_ + auVar40._12_4_;
  auVar60 = auVar236._0_16_;
  auVar40 = vfmadd231ps_avx512vl(auVar42,auVar5,auVar60);
  auVar41 = vfnmadd231ps_avx512vl(auVar40,auVar58,auVar60);
  auVar76._0_4_ = auVar45._0_4_ * 0.0;
  auVar76._4_4_ = auVar45._4_4_ * 0.0;
  auVar76._8_4_ = auVar45._8_4_ * 0.0;
  auVar76._12_4_ = auVar45._12_4_ * 0.0;
  auVar42 = vfmadd231ps_fma(auVar76,auVar46,auVar59);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar47,auVar42);
  auVar77._0_4_ = auVar39._0_4_ + auVar40._0_4_;
  auVar77._4_4_ = auVar39._4_4_ + auVar40._4_4_;
  auVar77._8_4_ = auVar39._8_4_ + auVar40._8_4_;
  auVar77._12_4_ = auVar39._12_4_ + auVar40._12_4_;
  auVar40 = vfmadd231ps_avx512vl(auVar42,auVar47,auVar60);
  auVar42 = vfnmadd231ps_avx512vl(auVar40,auVar39,auVar60);
  auVar40 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar44,auVar43);
  auVar40 = vfmadd231ps_fma(auVar40,auVar5,auVar59);
  auVar40 = vfmadd231ps_fma(auVar40,auVar58,auVar59);
  auVar43 = vmulps_avx512vl(auVar43,auVar60);
  auVar44 = vfnmadd231ps_avx512vl(auVar43,auVar60,auVar44);
  auVar5 = vfmadd231ps_fma(auVar44,auVar59,auVar5);
  auVar44 = vfnmadd231ps_fma(auVar5,auVar59,auVar58);
  auVar58 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar46,auVar45);
  auVar58 = vfmadd231ps_fma(auVar58,auVar47,auVar59);
  auVar58 = vfmadd231ps_fma(auVar58,auVar39,auVar59);
  auVar45 = vmulps_avx512vl(auVar45,auVar60);
  auVar46 = vfnmadd231ps_avx512vl(auVar45,auVar60,auVar46);
  auVar47 = vfmadd231ps_fma(auVar46,auVar59,auVar47);
  auVar5 = vfnmadd231ps_fma(auVar47,auVar59,auVar39);
  auVar39 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar47 = vshufps_avx(auVar77,auVar77,0xc9);
  fVar204 = auVar41._0_4_;
  auVar50._0_4_ = fVar204 * auVar47._0_4_;
  fVar127 = auVar41._4_4_;
  auVar50._4_4_ = fVar127 * auVar47._4_4_;
  fVar128 = auVar41._8_4_;
  auVar50._8_4_ = fVar128 * auVar47._8_4_;
  fVar138 = auVar41._12_4_;
  auVar50._12_4_ = fVar138 * auVar47._12_4_;
  auVar47 = vfmsub231ps_fma(auVar50,auVar39,auVar77);
  auVar46 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar47 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar51._0_4_ = fVar204 * auVar47._0_4_;
  auVar51._4_4_ = fVar127 * auVar47._4_4_;
  auVar51._8_4_ = fVar128 * auVar47._8_4_;
  auVar51._12_4_ = fVar138 * auVar47._12_4_;
  auVar39 = vfmsub231ps_fma(auVar51,auVar39,auVar42);
  auVar45 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar47 = vshufps_avx(auVar58,auVar58,0xc9);
  fVar148 = auVar44._0_4_;
  auVar48._0_4_ = fVar148 * auVar47._0_4_;
  fVar153 = auVar44._4_4_;
  auVar48._4_4_ = fVar153 * auVar47._4_4_;
  fVar154 = auVar44._8_4_;
  auVar48._8_4_ = fVar154 * auVar47._8_4_;
  fVar155 = auVar44._12_4_;
  auVar48._12_4_ = fVar155 * auVar47._12_4_;
  auVar47 = vfmsub231ps_fma(auVar48,auVar39,auVar58);
  auVar58 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar47 = vshufps_avx(auVar5,auVar5,0xc9);
  auVar69._0_4_ = auVar47._0_4_ * fVar148;
  auVar69._4_4_ = auVar47._4_4_ * fVar153;
  auVar69._8_4_ = auVar47._8_4_ * fVar154;
  auVar69._12_4_ = auVar47._12_4_ * fVar155;
  auVar47 = vfmsub231ps_fma(auVar69,auVar39,auVar5);
  auVar39 = vdpps_avx(auVar46,auVar46,0x7f);
  auVar5 = vshufps_avx(auVar47,auVar47,0xc9);
  fVar122 = auVar39._0_4_;
  auVar70._4_12_ = ZEXT812(0) << 0x20;
  auVar70._0_4_ = fVar122;
  auVar47 = vrsqrt14ss_avx512f(auVar59,auVar70);
  auVar43 = vmulss_avx512f(auVar47,ZEXT416(0x3fc00000));
  auVar42 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
  fVar205 = auVar47._0_4_;
  auVar47 = vdpps_avx(auVar46,auVar45,0x7f);
  fVar195 = auVar43._0_4_ - auVar42._0_4_ * fVar205 * fVar205 * fVar205;
  fVar206 = fVar195 * auVar46._0_4_;
  fVar214 = fVar195 * auVar46._4_4_;
  fVar215 = fVar195 * auVar46._8_4_;
  fVar216 = fVar195 * auVar46._12_4_;
  auVar82._0_4_ = auVar45._0_4_ * fVar122;
  auVar82._4_4_ = auVar45._4_4_ * fVar122;
  auVar82._8_4_ = auVar45._8_4_ * fVar122;
  auVar82._12_4_ = auVar45._12_4_ * fVar122;
  fVar122 = auVar47._0_4_;
  auVar64._0_4_ = fVar122 * auVar46._0_4_;
  auVar64._4_4_ = fVar122 * auVar46._4_4_;
  auVar64._8_4_ = fVar122 * auVar46._8_4_;
  auVar64._12_4_ = fVar122 * auVar46._12_4_;
  auVar46 = vsubps_avx(auVar82,auVar64);
  auVar47 = vrcp14ss_avx512f(auVar59,auVar70);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar47,ZEXT416(0x40000000));
  fVar122 = auVar47._0_4_ * auVar39._0_4_;
  auVar39 = vdpps_avx(auVar58,auVar58,0x7f);
  fVar205 = auVar39._0_4_;
  auVar71._4_12_ = ZEXT812(0) << 0x20;
  auVar71._0_4_ = fVar205;
  auVar47 = vrsqrt14ss_avx512f(auVar59,auVar71);
  auVar45 = vmulss_avx512f(auVar47,ZEXT416(0x3fc00000));
  auVar43 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
  fVar203 = auVar47._0_4_;
  fVar203 = auVar45._0_4_ - auVar43._0_4_ * fVar203 * fVar203 * fVar203;
  auVar47 = vdpps_avx(auVar58,auVar5,0x7f);
  fVar217 = fVar203 * auVar58._0_4_;
  fVar224 = fVar203 * auVar58._4_4_;
  fVar225 = fVar203 * auVar58._8_4_;
  fVar226 = fVar203 * auVar58._12_4_;
  auVar52._0_4_ = fVar205 * auVar5._0_4_;
  auVar52._4_4_ = fVar205 * auVar5._4_4_;
  auVar52._8_4_ = fVar205 * auVar5._8_4_;
  auVar52._12_4_ = fVar205 * auVar5._12_4_;
  fVar205 = auVar47._0_4_;
  auVar49._0_4_ = fVar205 * auVar58._0_4_;
  auVar49._4_4_ = fVar205 * auVar58._4_4_;
  auVar49._8_4_ = fVar205 * auVar58._8_4_;
  auVar49._12_4_ = fVar205 * auVar58._12_4_;
  auVar45 = vsubps_avx(auVar52,auVar49);
  auVar47 = vrcp14ss_avx512f(auVar59,auVar71);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar47,ZEXT416(0x40000000));
  fVar205 = auVar39._0_4_ * auVar47._0_4_;
  auVar39 = vshufps_avx(auVar61,auVar61,0xff);
  auVar66._0_4_ = fVar206 * auVar39._0_4_;
  auVar66._4_4_ = fVar214 * auVar39._4_4_;
  auVar66._8_4_ = fVar215 * auVar39._8_4_;
  auVar66._12_4_ = fVar216 * auVar39._12_4_;
  auVar5 = vsubps_avx(auVar61,auVar66);
  auVar47 = vshufps_avx(auVar41,auVar41,0xff);
  auVar53._0_4_ = auVar47._0_4_ * fVar206 + auVar39._0_4_ * fVar195 * fVar122 * auVar46._0_4_;
  auVar53._4_4_ = auVar47._4_4_ * fVar214 + auVar39._4_4_ * fVar195 * fVar122 * auVar46._4_4_;
  auVar53._8_4_ = auVar47._8_4_ * fVar215 + auVar39._8_4_ * fVar195 * fVar122 * auVar46._8_4_;
  auVar53._12_4_ = auVar47._12_4_ * fVar216 + auVar39._12_4_ * fVar195 * fVar122 * auVar46._12_4_;
  auVar46 = vsubps_avx(auVar41,auVar53);
  auVar230._0_4_ = auVar66._0_4_ + auVar61._0_4_;
  auVar230._4_4_ = auVar66._4_4_ + auVar61._4_4_;
  auVar230._8_4_ = auVar66._8_4_ + auVar61._8_4_;
  auVar230._12_4_ = auVar66._12_4_ + auVar61._12_4_;
  auVar39 = vshufps_avx(auVar40,auVar40,0xff);
  auVar56._0_4_ = fVar217 * auVar39._0_4_;
  auVar56._4_4_ = fVar224 * auVar39._4_4_;
  auVar56._8_4_ = fVar225 * auVar39._8_4_;
  auVar56._12_4_ = fVar226 * auVar39._12_4_;
  auVar48 = vsubps_avx512vl(auVar40,auVar56);
  auVar47 = vshufps_avx(auVar44,auVar44,0xff);
  auVar62._0_4_ = auVar47._0_4_ * fVar217 + auVar39._0_4_ * fVar203 * auVar45._0_4_ * fVar205;
  auVar62._4_4_ = auVar47._4_4_ * fVar224 + auVar39._4_4_ * fVar203 * auVar45._4_4_ * fVar205;
  auVar62._8_4_ = auVar47._8_4_ * fVar225 + auVar39._8_4_ * fVar203 * auVar45._8_4_ * fVar205;
  auVar62._12_4_ = auVar47._12_4_ * fVar226 + auVar39._12_4_ * fVar203 * auVar45._12_4_ * fVar205;
  auVar39 = vsubps_avx(auVar44,auVar62);
  auVar218._0_4_ = auVar40._0_4_ + auVar56._0_4_;
  auVar218._4_4_ = auVar40._4_4_ + auVar56._4_4_;
  auVar218._8_4_ = auVar40._8_4_ + auVar56._8_4_;
  auVar218._12_4_ = auVar40._12_4_ + auVar56._12_4_;
  auVar139._0_4_ = auVar46._0_4_ * 0.33333334;
  auVar139._4_4_ = auVar46._4_4_ * 0.33333334;
  auVar139._8_4_ = auVar46._8_4_ * 0.33333334;
  auVar139._12_4_ = auVar46._12_4_ * 0.33333334;
  auVar49 = vaddps_avx512vl(auVar5,auVar139);
  auVar140._0_4_ = auVar39._0_4_ * 0.33333334;
  auVar140._4_4_ = auVar39._4_4_ * 0.33333334;
  auVar140._8_4_ = auVar39._8_4_ * 0.33333334;
  auVar140._12_4_ = auVar39._12_4_ * 0.33333334;
  auVar50 = vsubps_avx512vl(auVar48,auVar140);
  auVar41._0_4_ = (fVar204 + auVar53._0_4_) * 0.33333334;
  auVar41._4_4_ = (fVar127 + auVar53._4_4_) * 0.33333334;
  auVar41._8_4_ = (fVar128 + auVar53._8_4_) * 0.33333334;
  auVar41._12_4_ = (fVar138 + auVar53._12_4_) * 0.33333334;
  auVar51 = vaddps_avx512vl(auVar230,auVar41);
  auVar59._0_4_ = (fVar148 + auVar62._0_4_) * 0.33333334;
  auVar59._4_4_ = (fVar153 + auVar62._4_4_) * 0.33333334;
  auVar59._8_4_ = (fVar154 + auVar62._8_4_) * 0.33333334;
  auVar59._12_4_ = (fVar155 + auVar62._12_4_) * 0.33333334;
  auVar52 = vsubps_avx512vl(auVar218,auVar59);
  auVar44 = vsubps_avx(auVar5,auVar80);
  uVar129 = auVar44._0_4_;
  auVar132._4_4_ = uVar129;
  auVar132._0_4_ = uVar129;
  auVar132._8_4_ = uVar129;
  auVar132._12_4_ = uVar129;
  auVar39 = vshufps_avx(auVar44,auVar44,0x55);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  auVar47 = vshufps_avx(auVar44,auVar44,0xaa);
  fVar122 = pre->ray_space[k].vz.field_0.m128[0];
  fVar205 = pre->ray_space[k].vz.field_0.m128[1];
  fVar195 = pre->ray_space[k].vz.field_0.m128[2];
  fVar203 = pre->ray_space[k].vz.field_0.m128[3];
  auVar60._0_4_ = fVar122 * auVar47._0_4_;
  auVar60._4_4_ = fVar205 * auVar47._4_4_;
  auVar60._8_4_ = fVar195 * auVar47._8_4_;
  auVar60._12_4_ = fVar203 * auVar47._12_4_;
  auVar39 = vfmadd231ps_fma(auVar60,(undefined1  [16])aVar4,auVar39);
  auVar59 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar132);
  auVar53 = vsubps_avx512vl(auVar49,auVar80);
  uVar129 = auVar53._0_4_;
  auVar54._4_4_ = uVar129;
  auVar54._0_4_ = uVar129;
  auVar54._8_4_ = uVar129;
  auVar54._12_4_ = uVar129;
  auVar39 = vshufps_avx(auVar53,auVar53,0x55);
  auVar47 = vshufps_avx(auVar53,auVar53,0xaa);
  auVar133._0_4_ = fVar122 * auVar47._0_4_;
  auVar133._4_4_ = fVar205 * auVar47._4_4_;
  auVar133._8_4_ = fVar195 * auVar47._8_4_;
  auVar133._12_4_ = fVar203 * auVar47._12_4_;
  auVar39 = vfmadd231ps_fma(auVar133,(undefined1  [16])aVar4,auVar39);
  auVar60 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar54);
  auVar54 = vsubps_avx512vl(auVar50,auVar80);
  uVar129 = auVar54._0_4_;
  auVar57._4_4_ = uVar129;
  auVar57._0_4_ = uVar129;
  auVar57._8_4_ = uVar129;
  auVar57._12_4_ = uVar129;
  auVar39 = vshufps_avx(auVar54,auVar54,0x55);
  auVar47 = vshufps_avx(auVar54,auVar54,0xaa);
  auVar55._0_4_ = fVar122 * auVar47._0_4_;
  auVar55._4_4_ = fVar205 * auVar47._4_4_;
  auVar55._8_4_ = fVar195 * auVar47._8_4_;
  auVar55._12_4_ = fVar203 * auVar47._12_4_;
  auVar39 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar4,auVar39);
  auVar61 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar57);
  auVar55 = vsubps_avx512vl(auVar48,auVar80);
  uVar129 = auVar55._0_4_;
  auVar67._4_4_ = uVar129;
  auVar67._0_4_ = uVar129;
  auVar67._8_4_ = uVar129;
  auVar67._12_4_ = uVar129;
  auVar39 = vshufps_avx(auVar55,auVar55,0x55);
  auVar47 = vshufps_avx(auVar55,auVar55,0xaa);
  auVar63._0_4_ = fVar122 * auVar47._0_4_;
  auVar63._4_4_ = fVar205 * auVar47._4_4_;
  auVar63._8_4_ = fVar195 * auVar47._8_4_;
  auVar63._12_4_ = fVar203 * auVar47._12_4_;
  auVar39 = vfmadd231ps_fma(auVar63,(undefined1  [16])aVar4,auVar39);
  auVar62 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar67);
  auVar43 = vsubps_avx(auVar230,auVar80);
  uVar129 = auVar43._0_4_;
  auVar68._4_4_ = uVar129;
  auVar68._0_4_ = uVar129;
  auVar68._8_4_ = uVar129;
  auVar68._12_4_ = uVar129;
  auVar39 = vshufps_avx(auVar43,auVar43,0x55);
  auVar47 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar85._0_4_ = auVar47._0_4_ * fVar122;
  auVar85._4_4_ = auVar47._4_4_ * fVar205;
  auVar85._8_4_ = auVar47._8_4_ * fVar195;
  auVar85._12_4_ = auVar47._12_4_ * fVar203;
  auVar39 = vfmadd231ps_fma(auVar85,(undefined1  [16])aVar4,auVar39);
  auVar132 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar68);
  auVar56 = vsubps_avx512vl(auVar51,auVar80);
  uVar129 = auVar56._0_4_;
  auVar72._4_4_ = uVar129;
  auVar72._0_4_ = uVar129;
  auVar72._8_4_ = uVar129;
  auVar72._12_4_ = uVar129;
  auVar39 = vshufps_avx(auVar56,auVar56,0x55);
  auVar47 = vshufps_avx(auVar56,auVar56,0xaa);
  auVar75._0_4_ = auVar47._0_4_ * fVar122;
  auVar75._4_4_ = auVar47._4_4_ * fVar205;
  auVar75._8_4_ = auVar47._8_4_ * fVar195;
  auVar75._12_4_ = auVar47._12_4_ * fVar203;
  auVar39 = vfmadd231ps_fma(auVar75,(undefined1  [16])aVar4,auVar39);
  auVar133 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar72);
  auVar57 = vsubps_avx512vl(auVar52,auVar80);
  uVar129 = auVar57._0_4_;
  auVar86._4_4_ = uVar129;
  auVar86._0_4_ = uVar129;
  auVar86._8_4_ = uVar129;
  auVar86._12_4_ = uVar129;
  auVar39 = vshufps_avx(auVar57,auVar57,0x55);
  auVar47 = vshufps_avx(auVar57,auVar57,0xaa);
  auVar79._0_4_ = auVar47._0_4_ * fVar122;
  auVar79._4_4_ = auVar47._4_4_ * fVar205;
  auVar79._8_4_ = auVar47._8_4_ * fVar195;
  auVar79._12_4_ = auVar47._12_4_ * fVar203;
  auVar39 = vfmadd231ps_fma(auVar79,(undefined1  [16])aVar4,auVar39);
  auVar139 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar86);
  auVar40 = vsubps_avx(auVar218,auVar80);
  uVar129 = auVar40._0_4_;
  auVar42._4_4_ = uVar129;
  auVar42._0_4_ = uVar129;
  auVar42._8_4_ = uVar129;
  auVar42._12_4_ = uVar129;
  auVar39 = vshufps_avx(auVar40,auVar40,0x55);
  auVar47 = vshufps_avx(auVar40,auVar40,0xaa);
  auVar65._0_4_ = auVar47._0_4_ * fVar122;
  auVar65._4_4_ = auVar47._4_4_ * fVar205;
  auVar65._8_4_ = auVar47._8_4_ * fVar195;
  auVar65._12_4_ = auVar47._12_4_ * fVar203;
  auVar39 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar4,auVar39);
  auVar140 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar42);
  auVar46 = vmovlhps_avx(auVar59,auVar132);
  auVar45 = vmovlhps_avx(auVar60,auVar133);
  auVar42 = vmovlhps_avx512f(auVar61,auVar139);
  auVar41 = vmovlhps_avx512f(auVar62,auVar140);
  auVar47 = vminps_avx(auVar46,auVar45);
  auVar39 = vmaxps_avx(auVar46,auVar45);
  auVar58 = vminps_avx512vl(auVar42,auVar41);
  auVar47 = vminps_avx(auVar47,auVar58);
  auVar58 = vmaxps_avx512vl(auVar42,auVar41);
  auVar39 = vmaxps_avx(auVar39,auVar58);
  auVar58 = vshufpd_avx(auVar47,auVar47,3);
  auVar47 = vminps_avx(auVar47,auVar58);
  auVar58 = vshufpd_avx(auVar39,auVar39,3);
  auVar39 = vmaxps_avx(auVar39,auVar58);
  auVar47 = vandps_avx512vl(auVar47,auVar237._0_16_);
  auVar39 = vandps_avx512vl(auVar39,auVar237._0_16_);
  auVar39 = vmaxps_avx(auVar47,auVar39);
  auVar47 = vmovshdup_avx(auVar39);
  auVar39 = vmaxss_avx(auVar47,auVar39);
  fVar122 = auVar39._0_4_ * 9.536743e-07;
  auVar59 = vmovddup_avx512vl(auVar59);
  auVar60 = vmovddup_avx512vl(auVar60);
  auVar61 = vmovddup_avx512vl(auVar61);
  auVar130._8_8_ = auVar62._0_8_;
  auVar130._0_8_ = auVar62._0_8_;
  auVar94 = vbroadcastss_avx512vl(ZEXT416((uint)fVar122));
  auVar39 = vxorps_avx512vl(auVar94._0_16_,auVar238._0_16_);
  auVar91 = vbroadcastss_avx512vl(auVar39);
  uVar29 = 0;
  auVar39 = vsubps_avx(auVar45,auVar46);
  auVar62 = vsubps_avx512vl(auVar42,auVar45);
  auVar63 = vsubps_avx512vl(auVar41,auVar42);
  auVar47 = vsubps_avx(auVar230,auVar5);
  auVar64 = vsubps_avx512vl(auVar51,auVar49);
  auVar65 = vsubps_avx512vl(auVar52,auVar50);
  auVar66 = vsubps_avx512vl(auVar218,auVar48);
  auVar67 = vpbroadcastd_avx512vl();
  auVar68 = vpbroadcastd_avx512vl();
  auVar58 = ZEXT816(0x3f80000000000000);
  auVar80 = auVar58;
LAB_019c27ac:
  do {
    auVar72 = vshufps_avx(auVar80,auVar80,0x50);
    auVar81._8_4_ = 0x3f800000;
    auVar81._0_8_ = 0x3f8000003f800000;
    auVar81._12_4_ = 0x3f800000;
    auVar229._16_4_ = 0x3f800000;
    auVar229._0_16_ = auVar81;
    auVar229._20_4_ = 0x3f800000;
    auVar229._24_4_ = 0x3f800000;
    auVar229._28_4_ = 0x3f800000;
    auVar86 = vsubps_avx(auVar81,auVar72);
    fVar205 = auVar72._0_4_;
    fVar127 = auVar132._0_4_;
    auVar149._0_4_ = fVar127 * fVar205;
    fVar195 = auVar72._4_4_;
    fVar128 = auVar132._4_4_;
    auVar149._4_4_ = fVar128 * fVar195;
    fVar203 = auVar72._8_4_;
    auVar149._8_4_ = fVar127 * fVar203;
    fVar204 = auVar72._12_4_;
    auVar149._12_4_ = fVar128 * fVar204;
    fVar138 = auVar133._0_4_;
    auVar73._0_4_ = fVar138 * fVar205;
    fVar148 = auVar133._4_4_;
    auVar73._4_4_ = fVar148 * fVar195;
    auVar73._8_4_ = fVar138 * fVar203;
    auVar73._12_4_ = fVar148 * fVar204;
    fVar153 = auVar139._0_4_;
    auVar74._0_4_ = fVar153 * fVar205;
    fVar154 = auVar139._4_4_;
    auVar74._4_4_ = fVar154 * fVar195;
    auVar74._8_4_ = fVar153 * fVar203;
    auVar74._12_4_ = fVar154 * fVar204;
    fVar155 = auVar140._0_4_;
    auVar78._0_4_ = fVar155 * fVar205;
    fVar206 = auVar140._4_4_;
    auVar78._4_4_ = fVar206 * fVar195;
    auVar78._8_4_ = fVar155 * fVar203;
    auVar78._12_4_ = fVar206 * fVar204;
    auVar69 = vfmadd231ps_avx512vl(auVar149,auVar86,auVar59);
    auVar70 = vfmadd231ps_avx512vl(auVar73,auVar86,auVar60);
    auVar71 = vfmadd231ps_avx512vl(auVar74,auVar86,auVar61);
    auVar86 = vfmadd231ps_fma(auVar78,auVar130,auVar86);
    auVar72 = vmovshdup_avx(auVar58);
    fVar195 = auVar58._0_4_;
    fVar205 = (auVar72._0_4_ - fVar195) * 0.04761905;
    auVar178._4_4_ = fVar195;
    auVar178._0_4_ = fVar195;
    auVar178._8_4_ = fVar195;
    auVar178._12_4_ = fVar195;
    auVar178._16_4_ = fVar195;
    auVar178._20_4_ = fVar195;
    auVar178._24_4_ = fVar195;
    auVar178._28_4_ = fVar195;
    auVar146._0_8_ = auVar72._0_8_;
    auVar146._8_8_ = auVar146._0_8_;
    auVar146._16_8_ = auVar146._0_8_;
    auVar146._24_8_ = auVar146._0_8_;
    auVar92 = vsubps_avx(auVar146,auVar178);
    uVar129 = auVar69._0_4_;
    auVar147._4_4_ = uVar129;
    auVar147._0_4_ = uVar129;
    auVar147._8_4_ = uVar129;
    auVar147._12_4_ = uVar129;
    auVar147._16_4_ = uVar129;
    auVar147._20_4_ = uVar129;
    auVar147._24_4_ = uVar129;
    auVar147._28_4_ = uVar129;
    auVar192._8_4_ = 1;
    auVar192._0_8_ = 0x100000001;
    auVar192._12_4_ = 1;
    auVar192._16_4_ = 1;
    auVar192._20_4_ = 1;
    auVar192._24_4_ = 1;
    auVar192._28_4_ = 1;
    auVar93 = ZEXT1632(auVar69);
    auVar105 = vpermps_avx2(auVar192,auVar93);
    auVar95 = vbroadcastss_avx512vl(auVar70);
    auVar106 = ZEXT1632(auVar70);
    auVar96 = vpermps_avx512vl(auVar192,auVar106);
    auVar97 = vbroadcastss_avx512vl(auVar71);
    auVar101 = ZEXT1632(auVar71);
    auVar98 = vpermps_avx512vl(auVar192,auVar101);
    auVar89 = vbroadcastss_avx512vl(auVar86);
    auVar102 = ZEXT1632(auVar86);
    auVar90 = vpermps_avx512vl(auVar192,auVar102);
    auVar193._4_4_ = fVar205;
    auVar193._0_4_ = fVar205;
    auVar193._8_4_ = fVar205;
    auVar193._12_4_ = fVar205;
    auVar193._16_4_ = fVar205;
    auVar193._20_4_ = fVar205;
    auVar193._24_4_ = fVar205;
    auVar193._28_4_ = fVar205;
    auVar103 = auVar243._0_32_;
    auVar99 = vpermps_avx512vl(auVar103,auVar93);
    auVar173._8_4_ = 3;
    auVar173._0_8_ = 0x300000003;
    auVar173._12_4_ = 3;
    auVar173._16_4_ = 3;
    auVar173._20_4_ = 3;
    auVar173._24_4_ = 3;
    auVar173._28_4_ = 3;
    auVar87 = vpermps_avx512vl(auVar173,auVar93);
    auVar88 = vpermps_avx512vl(auVar103,auVar106);
    auVar93 = vpermps_avx2(auVar173,auVar106);
    auVar100 = vpermps_avx512vl(auVar103,auVar101);
    auVar106 = vpermps_avx2(auVar173,auVar101);
    auVar101 = vpermps_avx512vl(auVar103,auVar102);
    auVar102 = vpermps_avx512vl(auVar173,auVar102);
    auVar72 = vfmadd132ps_fma(auVar92,auVar178,_DAT_01f7b040);
    auVar92 = vsubps_avx(auVar229,ZEXT1632(auVar72));
    auVar103 = vmulps_avx512vl(auVar95,ZEXT1632(auVar72));
    auVar107 = ZEXT1632(auVar72);
    auVar104 = vmulps_avx512vl(auVar96,auVar107);
    auVar86 = vfmadd231ps_fma(auVar103,auVar92,auVar147);
    auVar69 = vfmadd231ps_fma(auVar104,auVar92,auVar105);
    auVar103 = vmulps_avx512vl(auVar97,auVar107);
    auVar104 = vmulps_avx512vl(auVar98,auVar107);
    auVar95 = vfmadd231ps_avx512vl(auVar103,auVar92,auVar95);
    auVar96 = vfmadd231ps_avx512vl(auVar104,auVar92,auVar96);
    auVar103 = vmulps_avx512vl(auVar89,auVar107);
    auVar104 = ZEXT1632(auVar72);
    auVar90 = vmulps_avx512vl(auVar90,auVar104);
    auVar97 = vfmadd231ps_avx512vl(auVar103,auVar92,auVar97);
    auVar98 = vfmadd231ps_avx512vl(auVar90,auVar92,auVar98);
    fVar203 = auVar72._0_4_;
    fVar204 = auVar72._4_4_;
    auVar161._4_4_ = fVar204 * auVar95._4_4_;
    auVar161._0_4_ = fVar203 * auVar95._0_4_;
    fVar214 = auVar72._8_4_;
    auVar161._8_4_ = fVar214 * auVar95._8_4_;
    fVar215 = auVar72._12_4_;
    auVar161._12_4_ = fVar215 * auVar95._12_4_;
    auVar161._16_4_ = auVar95._16_4_ * 0.0;
    auVar161._20_4_ = auVar95._20_4_ * 0.0;
    auVar161._24_4_ = auVar95._24_4_ * 0.0;
    auVar161._28_4_ = fVar195;
    auVar18._4_4_ = fVar204 * auVar96._4_4_;
    auVar18._0_4_ = fVar203 * auVar96._0_4_;
    auVar18._8_4_ = fVar214 * auVar96._8_4_;
    auVar18._12_4_ = fVar215 * auVar96._12_4_;
    auVar18._16_4_ = auVar96._16_4_ * 0.0;
    auVar18._20_4_ = auVar96._20_4_ * 0.0;
    auVar18._24_4_ = auVar96._24_4_ * 0.0;
    auVar18._28_4_ = auVar105._28_4_;
    auVar86 = vfmadd231ps_fma(auVar161,auVar92,ZEXT1632(auVar86));
    auVar69 = vfmadd231ps_fma(auVar18,auVar92,ZEXT1632(auVar69));
    auVar136._0_4_ = fVar203 * auVar97._0_4_;
    auVar136._4_4_ = fVar204 * auVar97._4_4_;
    auVar136._8_4_ = fVar214 * auVar97._8_4_;
    auVar136._12_4_ = fVar215 * auVar97._12_4_;
    auVar136._16_4_ = auVar97._16_4_ * 0.0;
    auVar136._20_4_ = auVar97._20_4_ * 0.0;
    auVar136._24_4_ = auVar97._24_4_ * 0.0;
    auVar136._28_4_ = 0;
    auVar19._4_4_ = fVar204 * auVar98._4_4_;
    auVar19._0_4_ = fVar203 * auVar98._0_4_;
    auVar19._8_4_ = fVar214 * auVar98._8_4_;
    auVar19._12_4_ = fVar215 * auVar98._12_4_;
    auVar19._16_4_ = auVar98._16_4_ * 0.0;
    auVar19._20_4_ = auVar98._20_4_ * 0.0;
    auVar19._24_4_ = auVar98._24_4_ * 0.0;
    auVar19._28_4_ = auVar97._28_4_;
    auVar70 = vfmadd231ps_fma(auVar136,auVar92,auVar95);
    auVar71 = vfmadd231ps_fma(auVar19,auVar92,auVar96);
    auVar20._28_4_ = auVar96._28_4_;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(fVar215 * auVar71._12_4_,
                            CONCAT48(fVar214 * auVar71._8_4_,
                                     CONCAT44(fVar204 * auVar71._4_4_,fVar203 * auVar71._0_4_))));
    auVar82 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar215 * auVar70._12_4_,
                                                 CONCAT48(fVar214 * auVar70._8_4_,
                                                          CONCAT44(fVar204 * auVar70._4_4_,
                                                                   fVar203 * auVar70._0_4_)))),
                              auVar92,ZEXT1632(auVar86));
    auVar85 = vfmadd231ps_fma(auVar20,auVar92,ZEXT1632(auVar69));
    auVar105 = vsubps_avx(ZEXT1632(auVar70),ZEXT1632(auVar86));
    auVar95 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar69));
    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar105 = vmulps_avx512vl(auVar105,auVar96);
    auVar95 = vmulps_avx512vl(auVar95,auVar96);
    auVar187._0_4_ = fVar205 * auVar105._0_4_;
    auVar187._4_4_ = fVar205 * auVar105._4_4_;
    auVar187._8_4_ = fVar205 * auVar105._8_4_;
    auVar187._12_4_ = fVar205 * auVar105._12_4_;
    auVar187._16_4_ = fVar205 * auVar105._16_4_;
    auVar187._20_4_ = fVar205 * auVar105._20_4_;
    auVar187._24_4_ = fVar205 * auVar105._24_4_;
    auVar187._28_4_ = 0;
    auVar105 = vmulps_avx512vl(auVar193,auVar95);
    auVar69 = vxorps_avx512vl(auVar89._0_16_,auVar89._0_16_);
    auVar95 = vpermt2ps_avx512vl(ZEXT1632(auVar82),_DAT_01fb9fc0,ZEXT1632(auVar69));
    auVar97 = vpermt2ps_avx512vl(ZEXT1632(auVar85),_DAT_01fb9fc0,ZEXT1632(auVar69));
    auVar137._0_4_ = auVar187._0_4_ + auVar82._0_4_;
    auVar137._4_4_ = auVar187._4_4_ + auVar82._4_4_;
    auVar137._8_4_ = auVar187._8_4_ + auVar82._8_4_;
    auVar137._12_4_ = auVar187._12_4_ + auVar82._12_4_;
    auVar137._16_4_ = auVar187._16_4_ + 0.0;
    auVar137._20_4_ = auVar187._20_4_ + 0.0;
    auVar137._24_4_ = auVar187._24_4_ + 0.0;
    auVar137._28_4_ = 0;
    auVar107 = ZEXT1632(auVar69);
    auVar98 = vpermt2ps_avx512vl(auVar187,_DAT_01fb9fc0,auVar107);
    auVar89 = vaddps_avx512vl(ZEXT1632(auVar85),auVar105);
    auVar90 = vpermt2ps_avx512vl(auVar105,_DAT_01fb9fc0,auVar107);
    auVar105 = vsubps_avx(auVar95,auVar98);
    auVar98 = vsubps_avx512vl(auVar97,auVar90);
    auVar90 = vmulps_avx512vl(auVar88,auVar104);
    auVar103 = vmulps_avx512vl(auVar93,auVar104);
    auVar90 = vfmadd231ps_avx512vl(auVar90,auVar92,auVar99);
    auVar99 = vfmadd231ps_avx512vl(auVar103,auVar92,auVar87);
    auVar87 = vmulps_avx512vl(auVar100,auVar104);
    auVar103 = vmulps_avx512vl(auVar106,auVar104);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar92,auVar88);
    auVar93 = vfmadd231ps_avx512vl(auVar103,auVar92,auVar93);
    auVar88 = vmulps_avx512vl(auVar101,auVar104);
    auVar101 = vmulps_avx512vl(auVar102,auVar104);
    auVar86 = vfmadd231ps_fma(auVar88,auVar92,auVar100);
    auVar88 = vfmadd231ps_avx512vl(auVar101,auVar92,auVar106);
    auVar100 = vmulps_avx512vl(auVar104,auVar87);
    auVar102 = ZEXT1632(auVar72);
    auVar101 = vmulps_avx512vl(auVar102,auVar93);
    auVar90 = vfmadd231ps_avx512vl(auVar100,auVar92,auVar90);
    auVar99 = vfmadd231ps_avx512vl(auVar101,auVar92,auVar99);
    auVar88 = vmulps_avx512vl(auVar102,auVar88);
    auVar87 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar215 * auVar86._12_4_,
                                            CONCAT48(fVar214 * auVar86._8_4_,
                                                     CONCAT44(fVar204 * auVar86._4_4_,
                                                              fVar203 * auVar86._0_4_)))),auVar92,
                         auVar87);
    auVar93 = vfmadd231ps_avx512vl(auVar88,auVar92,auVar93);
    auVar21._4_4_ = fVar204 * auVar87._4_4_;
    auVar21._0_4_ = fVar203 * auVar87._0_4_;
    auVar21._8_4_ = fVar214 * auVar87._8_4_;
    auVar21._12_4_ = fVar215 * auVar87._12_4_;
    auVar21._16_4_ = auVar87._16_4_ * 0.0;
    auVar21._20_4_ = auVar87._20_4_ * 0.0;
    auVar21._24_4_ = auVar87._24_4_ * 0.0;
    auVar21._28_4_ = auVar106._28_4_;
    auVar106 = vmulps_avx512vl(auVar102,auVar93);
    auVar88 = vfmadd231ps_avx512vl(auVar21,auVar92,auVar90);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar99,auVar92);
    auVar92 = vsubps_avx512vl(auVar87,auVar90);
    auVar93 = vsubps_avx512vl(auVar93,auVar99);
    auVar92 = vmulps_avx512vl(auVar92,auVar96);
    auVar93 = vmulps_avx512vl(auVar93,auVar96);
    fVar195 = fVar205 * auVar92._0_4_;
    fVar203 = fVar205 * auVar92._4_4_;
    auVar22._4_4_ = fVar203;
    auVar22._0_4_ = fVar195;
    fVar204 = fVar205 * auVar92._8_4_;
    auVar22._8_4_ = fVar204;
    fVar214 = fVar205 * auVar92._12_4_;
    auVar22._12_4_ = fVar214;
    fVar215 = fVar205 * auVar92._16_4_;
    auVar22._16_4_ = fVar215;
    fVar216 = fVar205 * auVar92._20_4_;
    auVar22._20_4_ = fVar216;
    fVar205 = fVar205 * auVar92._24_4_;
    auVar22._24_4_ = fVar205;
    auVar22._28_4_ = auVar92._28_4_;
    auVar93 = vmulps_avx512vl(auVar193,auVar93);
    auVar96 = vpermt2ps_avx512vl(auVar88,_DAT_01fb9fc0,auVar107);
    auVar90 = vpermt2ps_avx512vl(auVar106,_DAT_01fb9fc0,auVar107);
    auVar194._0_4_ = auVar88._0_4_ + fVar195;
    auVar194._4_4_ = auVar88._4_4_ + fVar203;
    auVar194._8_4_ = auVar88._8_4_ + fVar204;
    auVar194._12_4_ = auVar88._12_4_ + fVar214;
    auVar194._16_4_ = auVar88._16_4_ + fVar215;
    auVar194._20_4_ = auVar88._20_4_ + fVar216;
    auVar194._24_4_ = auVar88._24_4_ + fVar205;
    auVar194._28_4_ = auVar88._28_4_ + auVar92._28_4_;
    auVar92 = vpermt2ps_avx512vl(auVar22,_DAT_01fb9fc0,ZEXT1632(auVar69));
    auVar99 = vaddps_avx512vl(auVar106,auVar93);
    auVar93 = vpermt2ps_avx512vl(auVar93,_DAT_01fb9fc0,ZEXT1632(auVar69));
    auVar92 = vsubps_avx(auVar96,auVar92);
    auVar93 = vsubps_avx512vl(auVar90,auVar93);
    auVar151 = ZEXT1632(auVar82);
    auVar87 = vsubps_avx512vl(auVar88,auVar151);
    auVar161 = ZEXT1632(auVar85);
    auVar100 = vsubps_avx512vl(auVar106,auVar161);
    auVar101 = vsubps_avx512vl(auVar96,auVar95);
    auVar87 = vaddps_avx512vl(auVar87,auVar101);
    auVar101 = vsubps_avx512vl(auVar90,auVar97);
    auVar100 = vaddps_avx512vl(auVar100,auVar101);
    auVar101 = vmulps_avx512vl(auVar161,auVar87);
    auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar151,auVar100);
    auVar102 = vmulps_avx512vl(auVar89,auVar87);
    auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar137,auVar100);
    auVar103 = vmulps_avx512vl(auVar98,auVar87);
    auVar103 = vfnmadd231ps_avx512vl(auVar103,auVar105,auVar100);
    auVar104 = vmulps_avx512vl(auVar97,auVar87);
    auVar104 = vfnmadd231ps_avx512vl(auVar104,auVar95,auVar100);
    auVar107 = vmulps_avx512vl(auVar106,auVar87);
    auVar107 = vfnmadd231ps_avx512vl(auVar107,auVar88,auVar100);
    auVar108 = vmulps_avx512vl(auVar99,auVar87);
    auVar108 = vfnmadd231ps_avx512vl(auVar108,auVar194,auVar100);
    auVar109 = vmulps_avx512vl(auVar93,auVar87);
    auVar109 = vfnmadd231ps_avx512vl(auVar109,auVar92,auVar100);
    auVar87 = vmulps_avx512vl(auVar90,auVar87);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar96,auVar100);
    auVar100 = vminps_avx512vl(auVar101,auVar102);
    auVar101 = vmaxps_avx512vl(auVar101,auVar102);
    auVar102 = vminps_avx512vl(auVar103,auVar104);
    auVar100 = vminps_avx512vl(auVar100,auVar102);
    auVar102 = vmaxps_avx512vl(auVar103,auVar104);
    auVar101 = vmaxps_avx512vl(auVar101,auVar102);
    auVar102 = vminps_avx512vl(auVar107,auVar108);
    auVar103 = vmaxps_avx512vl(auVar107,auVar108);
    auVar104 = vminps_avx512vl(auVar109,auVar87);
    auVar102 = vminps_avx512vl(auVar102,auVar104);
    auVar100 = vminps_avx512vl(auVar100,auVar102);
    auVar87 = vmaxps_avx512vl(auVar109,auVar87);
    auVar87 = vmaxps_avx512vl(auVar103,auVar87);
    auVar87 = vmaxps_avx512vl(auVar101,auVar87);
    uVar14 = vcmpps_avx512vl(auVar100,auVar94,2);
    uVar15 = vcmpps_avx512vl(auVar87,auVar91,5);
    bVar27 = (byte)uVar14 & (byte)uVar15 & 0x7f;
    if (bVar27 != 0) {
      auVar87 = vsubps_avx512vl(auVar95,auVar151);
      auVar100 = vsubps_avx512vl(auVar97,auVar161);
      auVar101 = vsubps_avx512vl(auVar96,auVar88);
      auVar87 = vaddps_avx512vl(auVar87,auVar101);
      auVar101 = vsubps_avx512vl(auVar90,auVar106);
      auVar100 = vaddps_avx512vl(auVar100,auVar101);
      auVar101 = vmulps_avx512vl(auVar161,auVar87);
      auVar101 = vfnmadd231ps_avx512vl(auVar101,auVar100,auVar151);
      auVar89 = vmulps_avx512vl(auVar89,auVar87);
      auVar89 = vfnmadd213ps_avx512vl(auVar137,auVar100,auVar89);
      auVar98 = vmulps_avx512vl(auVar98,auVar87);
      auVar98 = vfnmadd213ps_avx512vl(auVar105,auVar100,auVar98);
      auVar105 = vmulps_avx512vl(auVar97,auVar87);
      auVar97 = vfnmadd231ps_avx512vl(auVar105,auVar100,auVar95);
      auVar105 = vmulps_avx512vl(auVar106,auVar87);
      auVar106 = vfnmadd231ps_avx512vl(auVar105,auVar100,auVar88);
      auVar105 = vmulps_avx512vl(auVar99,auVar87);
      auVar99 = vfnmadd213ps_avx512vl(auVar194,auVar100,auVar105);
      auVar105 = vmulps_avx512vl(auVar93,auVar87);
      auVar88 = vfnmadd213ps_avx512vl(auVar92,auVar100,auVar105);
      auVar92 = vmulps_avx512vl(auVar90,auVar87);
      auVar96 = vfnmadd231ps_avx512vl(auVar92,auVar96,auVar100);
      auVar105 = vminps_avx(auVar101,auVar89);
      auVar92 = vmaxps_avx(auVar101,auVar89);
      auVar95 = vminps_avx(auVar98,auVar97);
      auVar95 = vminps_avx(auVar105,auVar95);
      auVar105 = vmaxps_avx(auVar98,auVar97);
      auVar92 = vmaxps_avx(auVar92,auVar105);
      auVar93 = vminps_avx(auVar106,auVar99);
      auVar105 = vmaxps_avx(auVar106,auVar99);
      auVar106 = vminps_avx(auVar88,auVar96);
      auVar93 = vminps_avx(auVar93,auVar106);
      auVar93 = vminps_avx(auVar95,auVar93);
      auVar95 = vmaxps_avx(auVar88,auVar96);
      auVar105 = vmaxps_avx(auVar105,auVar95);
      auVar92 = vmaxps_avx(auVar92,auVar105);
      uVar14 = vcmpps_avx512vl(auVar92,auVar91,5);
      uVar15 = vcmpps_avx512vl(auVar93,auVar94,2);
      bVar27 = bVar27 & (byte)uVar14 & (byte)uVar15;
      if (bVar27 != 0) {
        mask_stack[uVar29] = (uint)bVar27;
        BVar2 = (BBox1f)vmovlps_avx(auVar58);
        cu_stack[uVar29] = BVar2;
        BVar2 = (BBox1f)vmovlps_avx(auVar80);
        cv_stack[uVar29] = BVar2;
        uVar29 = (ulong)((int)uVar29 + 1);
      }
    }
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar236 = ZEXT1664(auVar58);
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar237 = ZEXT1664(auVar58);
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar238 = ZEXT1664(auVar58);
    auVar92 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar239 = ZEXT3264(auVar92);
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
    auVar240 = ZEXT1664(auVar58);
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar241 = ZEXT1664(auVar58);
    auVar242 = ZEXT3264(_DAT_01fb9fe0);
LAB_019c2caa:
    do {
      do {
        do {
          if ((int)uVar29 == 0) {
            uVar129 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar17._4_4_ = uVar129;
            auVar17._0_4_ = uVar129;
            auVar17._8_4_ = uVar129;
            auVar17._12_4_ = uVar129;
            auVar17._16_4_ = uVar129;
            auVar17._20_4_ = uVar129;
            auVar17._24_4_ = uVar129;
            auVar17._28_4_ = uVar129;
            uVar14 = vcmpps_avx512vl(local_78,auVar17,2);
            uVar33 = (ulong)((uint)uVar33 & (uint)uVar14);
            goto LAB_019c206c;
          }
          uVar28 = (int)uVar29 - 1;
          uVar8 = mask_stack[uVar28];
          auVar80._8_8_ = 0;
          auVar80._0_4_ = cv_stack[uVar28].lower;
          auVar80._4_4_ = cv_stack[uVar28].upper;
          uVar34 = 0;
          for (uVar32 = (ulong)uVar8; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000)
          {
            uVar34 = uVar34 + 1;
          }
          uVar31 = uVar8 - 1 & uVar8;
          bVar37 = uVar31 == 0;
          mask_stack[uVar28] = uVar31;
          if (bVar37) {
            uVar29 = (ulong)uVar28;
          }
          auVar123._8_8_ = 0;
          auVar123._0_8_ = uVar34;
          auVar58 = vpunpcklqdq_avx(auVar123,ZEXT416((int)uVar34 + 1));
          auVar58 = vcvtqq2ps_avx512vl(auVar58);
          auVar58 = vmulps_avx512vl(auVar58,auVar240._0_16_);
          fVar205 = cu_stack[uVar28].upper;
          auVar83._4_4_ = fVar205;
          auVar83._0_4_ = fVar205;
          auVar83._8_4_ = fVar205;
          auVar83._12_4_ = fVar205;
          auVar72 = vmulps_avx512vl(auVar58,auVar83);
          auVar86 = auVar241._0_16_;
          auVar58 = vsubps_avx512vl(auVar86,auVar58);
          fVar205 = cu_stack[uVar28].lower;
          auVar84._4_4_ = fVar205;
          auVar84._0_4_ = fVar205;
          auVar84._8_4_ = fVar205;
          auVar84._12_4_ = fVar205;
          auVar58 = vfmadd231ps_avx512vl(auVar72,auVar58,auVar84);
          auVar72 = vmovshdup_avx(auVar58);
          fVar205 = auVar72._0_4_ - auVar58._0_4_;
          vucomiss_avx512f(ZEXT416((uint)fVar205));
          if (uVar8 == 0 || bVar37) goto LAB_019c27ac;
          auVar72 = vshufps_avx(auVar80,auVar80,0x50);
          vucomiss_avx512f(ZEXT416((uint)fVar205));
          auVar71 = vsubps_avx512vl(auVar86,auVar72);
          fVar195 = auVar72._0_4_;
          auVar156._0_4_ = fVar195 * fVar127;
          fVar203 = auVar72._4_4_;
          auVar156._4_4_ = fVar203 * fVar128;
          fVar204 = auVar72._8_4_;
          auVar156._8_4_ = fVar204 * fVar127;
          fVar214 = auVar72._12_4_;
          auVar156._12_4_ = fVar214 * fVar128;
          auVar164._0_4_ = fVar195 * fVar138;
          auVar164._4_4_ = fVar203 * fVar148;
          auVar164._8_4_ = fVar204 * fVar138;
          auVar164._12_4_ = fVar214 * fVar148;
          auVar169._0_4_ = fVar195 * fVar153;
          auVar169._4_4_ = fVar203 * fVar154;
          auVar169._8_4_ = fVar204 * fVar153;
          auVar169._12_4_ = fVar214 * fVar154;
          auVar141._0_4_ = fVar195 * fVar155;
          auVar141._4_4_ = fVar203 * fVar206;
          auVar141._8_4_ = fVar204 * fVar155;
          auVar141._12_4_ = fVar214 * fVar206;
          auVar72 = vfmadd231ps_fma(auVar156,auVar71,auVar59);
          auVar69 = vfmadd231ps_fma(auVar164,auVar71,auVar60);
          auVar70 = vfmadd231ps_fma(auVar169,auVar71,auVar61);
          auVar71 = vfmadd231ps_fma(auVar141,auVar71,auVar130);
          auVar152._16_16_ = auVar72;
          auVar152._0_16_ = auVar72;
          auVar162._16_16_ = auVar69;
          auVar162._0_16_ = auVar69;
          auVar168._16_16_ = auVar70;
          auVar168._0_16_ = auVar70;
          auVar105 = vpermps_avx512vl(auVar242._0_32_,ZEXT1632(auVar58));
          auVar92 = vsubps_avx(auVar162,auVar152);
          auVar69 = vfmadd213ps_fma(auVar92,auVar105,auVar152);
          auVar92 = vsubps_avx(auVar168,auVar162);
          auVar82 = vfmadd213ps_fma(auVar92,auVar105,auVar162);
          auVar72 = vsubps_avx(auVar71,auVar70);
          auVar163._16_16_ = auVar72;
          auVar163._0_16_ = auVar72;
          auVar72 = vfmadd213ps_fma(auVar163,auVar105,auVar168);
          auVar92 = vsubps_avx(ZEXT1632(auVar82),ZEXT1632(auVar69));
          auVar69 = vfmadd213ps_fma(auVar92,auVar105,ZEXT1632(auVar69));
          auVar92 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar82));
          auVar72 = vfmadd213ps_fma(auVar92,auVar105,ZEXT1632(auVar82));
          auVar92 = vsubps_avx(ZEXT1632(auVar72),ZEXT1632(auVar69));
          auVar149 = vfmadd231ps_fma(ZEXT1632(auVar69),auVar92,auVar105);
          auVar92 = vmulps_avx512vl(auVar92,auVar239._0_32_);
          auVar111._16_16_ = auVar92._16_16_;
          fVar195 = fVar205 * 0.33333334;
          auVar170._0_8_ =
               CONCAT44(auVar149._4_4_ + fVar195 * auVar92._4_4_,
                        auVar149._0_4_ + fVar195 * auVar92._0_4_);
          auVar170._8_4_ = auVar149._8_4_ + fVar195 * auVar92._8_4_;
          auVar170._12_4_ = auVar149._12_4_ + fVar195 * auVar92._12_4_;
          auVar157._0_4_ = fVar195 * auVar92._16_4_;
          auVar157._4_4_ = fVar195 * auVar92._20_4_;
          auVar157._8_4_ = fVar195 * auVar92._24_4_;
          auVar157._12_4_ = fVar195 * auVar92._28_4_;
          auVar79 = vsubps_avx((undefined1  [16])0x0,auVar157);
          auVar82 = vshufpd_avx(auVar149,auVar149,3);
          auVar85 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
          auVar72 = vsubps_avx(auVar82,auVar149);
          auVar69 = vsubps_avx(auVar85,(undefined1  [16])0x0);
          auVar179._0_4_ = auVar72._0_4_ + auVar69._0_4_;
          auVar179._4_4_ = auVar72._4_4_ + auVar69._4_4_;
          auVar179._8_4_ = auVar72._8_4_ + auVar69._8_4_;
          auVar179._12_4_ = auVar72._12_4_ + auVar69._12_4_;
          auVar72 = vshufps_avx(auVar149,auVar149,0xb1);
          auVar69 = vshufps_avx(auVar170,auVar170,0xb1);
          auVar70 = vshufps_avx(auVar79,auVar79,0xb1);
          auVar71 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
          auVar227._4_4_ = auVar179._0_4_;
          auVar227._0_4_ = auVar179._0_4_;
          auVar227._8_4_ = auVar179._0_4_;
          auVar227._12_4_ = auVar179._0_4_;
          auVar75 = vshufps_avx(auVar179,auVar179,0x55);
          fVar195 = auVar75._0_4_;
          auVar188._0_4_ = auVar72._0_4_ * fVar195;
          fVar203 = auVar75._4_4_;
          auVar188._4_4_ = auVar72._4_4_ * fVar203;
          fVar204 = auVar75._8_4_;
          auVar188._8_4_ = auVar72._8_4_ * fVar204;
          fVar214 = auVar75._12_4_;
          auVar188._12_4_ = auVar72._12_4_ * fVar214;
          auVar196._0_4_ = auVar69._0_4_ * fVar195;
          auVar196._4_4_ = auVar69._4_4_ * fVar203;
          auVar196._8_4_ = auVar69._8_4_ * fVar204;
          auVar196._12_4_ = auVar69._12_4_ * fVar214;
          auVar207._0_4_ = auVar70._0_4_ * fVar195;
          auVar207._4_4_ = auVar70._4_4_ * fVar203;
          auVar207._8_4_ = auVar70._8_4_ * fVar204;
          auVar207._12_4_ = auVar70._12_4_ * fVar214;
          auVar180._0_4_ = auVar71._0_4_ * fVar195;
          auVar180._4_4_ = auVar71._4_4_ * fVar203;
          auVar180._8_4_ = auVar71._8_4_ * fVar204;
          auVar180._12_4_ = auVar71._12_4_ * fVar214;
          auVar72 = vfmadd231ps_fma(auVar188,auVar227,auVar149);
          auVar69 = vfmadd231ps_fma(auVar196,auVar227,auVar170);
          auVar77 = vfmadd231ps_fma(auVar207,auVar227,auVar79);
          auVar78 = vfmadd231ps_fma(auVar180,(undefined1  [16])0x0,auVar227);
          auVar75 = vshufpd_avx(auVar72,auVar72,1);
          auVar76 = vshufpd_avx(auVar69,auVar69,1);
          auVar73 = vshufpd_avx512vl(auVar77,auVar77,1);
          auVar74 = vshufpd_avx512vl(auVar78,auVar78,1);
          auVar70 = vminss_avx(auVar72,auVar69);
          auVar72 = vmaxss_avx(auVar69,auVar72);
          auVar71 = vminss_avx(auVar77,auVar78);
          auVar69 = vmaxss_avx(auVar78,auVar77);
          auVar70 = vminss_avx(auVar70,auVar71);
          auVar72 = vmaxss_avx(auVar69,auVar72);
          auVar71 = vminss_avx(auVar75,auVar76);
          auVar69 = vmaxss_avx(auVar76,auVar75);
          auVar75 = vminss_avx512f(auVar73,auVar74);
          auVar76 = vmaxss_avx512f(auVar74,auVar73);
          auVar69 = vmaxss_avx(auVar76,auVar69);
          auVar71 = vminss_avx512f(auVar71,auVar75);
          fVar203 = auVar69._0_4_;
          fVar195 = auVar72._0_4_;
          if (auVar70._0_4_ < 0.0001) {
            bVar38 = fVar203 == -0.0001;
            bVar35 = NAN(fVar203);
            if (fVar203 <= -0.0001) goto LAB_019c2edc;
            break;
          }
LAB_019c2edc:
          vucomiss_avx512f(auVar71);
          bVar38 = fVar203 <= -0.0001;
          bVar36 = -0.0001 < fVar195;
          bVar35 = bVar38;
          if (!bVar38) break;
          uVar14 = vcmpps_avx512vl(auVar70,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar15 = vcmpps_avx512vl(auVar71,SUB6416(ZEXT464(0x38d1b717),0),5);
          uVar28 = (uint)uVar14 & (uint)uVar15;
          bVar23 = (uVar28 & 1) == 0;
          bVar38 = bVar36 && bVar23;
          bVar35 = bVar36 && (uVar28 & 1) == 0;
        } while (!bVar36 || !bVar23);
        auVar77 = auVar244._0_16_;
        vcmpss_avx512f(auVar70,auVar77,1);
        uVar14 = vcmpss_avx512f(auVar72,auVar77,1);
        bVar36 = (bool)((byte)uVar14 & 1);
        auVar111._0_16_ = auVar245._0_16_;
        auVar110._4_28_ = auVar111._4_28_;
        auVar110._0_4_ = (float)((uint)bVar36 * -0x40800000 + (uint)!bVar36 * auVar245._0_4_);
        vucomiss_avx512f(auVar110._0_16_);
        bVar35 = (bool)(!bVar38 | bVar35);
        bVar36 = bVar35 == false;
        auVar113._16_16_ = auVar111._16_16_;
        auVar113._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar112._4_28_ = auVar113._4_28_;
        auVar112._0_4_ = (uint)bVar35 * auVar244._0_4_ + (uint)!bVar35 * 0x7f800000;
        auVar76 = auVar112._0_16_;
        auVar115._16_16_ = auVar111._16_16_;
        auVar115._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar114._4_28_ = auVar115._4_28_;
        auVar114._0_4_ = (uint)bVar35 * auVar244._0_4_ + (uint)!bVar35 * -0x800000;
        auVar75 = auVar114._0_16_;
        uVar14 = vcmpss_avx512f(auVar71,auVar77,1);
        bVar38 = (bool)((byte)uVar14 & 1);
        auVar117._16_16_ = auVar111._16_16_;
        auVar117._0_16_ = auVar245._0_16_;
        auVar116._4_28_ = auVar117._4_28_;
        auVar116._0_4_ = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * auVar245._0_4_);
        vucomiss_avx512f(auVar116._0_16_);
        if ((bVar35) || (bVar36)) {
          auVar71 = vucomiss_avx512f(auVar70);
          if ((bVar35) || (bVar36)) {
            auVar78 = vxorps_avx512vl(auVar70,auVar238._0_16_);
            auVar70 = vsubss_avx512f(auVar71,auVar70);
            auVar70 = vdivss_avx512f(auVar78,auVar70);
            auVar71 = vsubss_avx512f(ZEXT416(0x3f800000),auVar70);
            auVar71 = vfmadd213ss_avx512f(auVar71,auVar77,auVar70);
            auVar70 = auVar71;
          }
          else {
            auVar70 = vxorps_avx512vl(auVar71,auVar71);
            vucomiss_avx512f(auVar70);
            auVar71 = ZEXT416(0x3f800000);
            if ((bVar35) || (bVar36)) {
              auVar71 = SUB6416(ZEXT464(0xff800000),0);
              auVar70 = SUB6416(ZEXT464(0x7f800000),0);
            }
          }
          auVar76 = vminss_avx512f(auVar76,auVar70);
          auVar75 = vmaxss_avx(auVar71,auVar75);
        }
        auVar245 = ZEXT464(0x3f800000);
        uVar14 = vcmpss_avx512f(auVar69,auVar77,1);
        bVar38 = (bool)((byte)uVar14 & 1);
        auVar69 = auVar245._0_16_;
        fVar204 = (float)((uint)bVar38 * -0x40800000 + (uint)!bVar38 * 0x3f800000);
        if ((auVar110._0_4_ != fVar204) || (NAN(auVar110._0_4_) || NAN(fVar204))) {
          if ((fVar203 != fVar195) || (NAN(fVar203) || NAN(fVar195))) {
            auVar72 = vxorps_avx512vl(auVar72,auVar238._0_16_);
            auVar181._0_4_ = auVar72._0_4_ / (fVar203 - fVar195);
            auVar181._4_12_ = auVar72._4_12_;
            auVar72 = vsubss_avx512f(auVar69,auVar181);
            auVar72 = vfmadd213ss_avx512f(auVar72,auVar77,auVar181);
            auVar70 = auVar72;
          }
          else if ((fVar195 != 0.0) ||
                  (auVar72 = auVar69, auVar70 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar195))) {
            auVar72 = SUB6416(ZEXT464(0xff800000),0);
            auVar70 = SUB6416(ZEXT464(0x7f800000),0);
          }
          auVar76 = vminss_avx(auVar76,auVar70);
          auVar75 = vmaxss_avx(auVar72,auVar75);
        }
        bVar38 = auVar116._0_4_ != fVar204;
        auVar72 = vminss_avx512f(auVar76,auVar69);
        auVar119._16_16_ = auVar111._16_16_;
        auVar119._0_16_ = auVar76;
        auVar118._4_28_ = auVar119._4_28_;
        auVar118._0_4_ = (uint)bVar38 * auVar72._0_4_ + (uint)!bVar38 * auVar76._0_4_;
        auVar72 = vmaxss_avx512f(auVar69,auVar75);
        auVar121._16_16_ = auVar111._16_16_;
        auVar121._0_16_ = auVar75;
        auVar120._4_28_ = auVar121._4_28_;
        auVar120._0_4_ = (uint)bVar38 * auVar72._0_4_ + (uint)!bVar38 * auVar75._0_4_;
        auVar72 = vmaxss_avx512f(auVar77,auVar118._0_16_);
        auVar70 = vminss_avx512f(auVar120._0_16_,auVar69);
      } while (auVar70._0_4_ < auVar72._0_4_);
      auVar77 = vmaxss_avx512f(auVar77,ZEXT416((uint)(auVar72._0_4_ + -0.1)));
      auVar78 = vminss_avx512f(ZEXT416((uint)(auVar70._0_4_ + 0.1)),auVar69);
      auVar142._0_8_ = auVar149._0_8_;
      auVar142._8_8_ = auVar142._0_8_;
      auVar197._8_8_ = auVar170._0_8_;
      auVar197._0_8_ = auVar170._0_8_;
      auVar208._8_8_ = auVar79._0_8_;
      auVar208._0_8_ = auVar79._0_8_;
      auVar72 = vshufpd_avx(auVar170,auVar170,3);
      auVar70 = vshufpd_avx(auVar79,auVar79,3);
      auVar71 = vshufps_avx(auVar77,auVar78,0);
      auVar76 = vsubps_avx512vl(auVar86,auVar71);
      fVar195 = auVar71._0_4_;
      auVar165._0_4_ = fVar195 * auVar82._0_4_;
      fVar203 = auVar71._4_4_;
      auVar165._4_4_ = fVar203 * auVar82._4_4_;
      fVar204 = auVar71._8_4_;
      auVar165._8_4_ = fVar204 * auVar82._8_4_;
      fVar214 = auVar71._12_4_;
      auVar165._12_4_ = fVar214 * auVar82._12_4_;
      auVar171._0_4_ = fVar195 * auVar72._0_4_;
      auVar171._4_4_ = fVar203 * auVar72._4_4_;
      auVar171._8_4_ = fVar204 * auVar72._8_4_;
      auVar171._12_4_ = fVar214 * auVar72._12_4_;
      auVar231._0_4_ = auVar70._0_4_ * fVar195;
      auVar231._4_4_ = auVar70._4_4_ * fVar203;
      auVar231._8_4_ = auVar70._8_4_ * fVar204;
      auVar231._12_4_ = auVar70._12_4_ * fVar214;
      auVar158._0_4_ = fVar195 * auVar85._0_4_;
      auVar158._4_4_ = fVar203 * auVar85._4_4_;
      auVar158._8_4_ = fVar204 * auVar85._8_4_;
      auVar158._12_4_ = fVar214 * auVar85._12_4_;
      auVar82 = vfmadd231ps_fma(auVar165,auVar76,auVar142);
      auVar85 = vfmadd231ps_fma(auVar171,auVar76,auVar197);
      auVar75 = vfmadd231ps_fma(auVar231,auVar76,auVar208);
      auVar76 = vfmadd231ps_fma(auVar158,auVar76,ZEXT816(0));
      auVar70 = vsubss_avx512f(auVar69,auVar77);
      auVar72 = vmovshdup_avx(auVar80);
      auVar149 = vfmadd231ss_fma(ZEXT416((uint)(auVar72._0_4_ * auVar77._0_4_)),auVar80,auVar70);
      auVar70 = vsubss_avx512f(auVar69,auVar78);
      auVar73 = vfmadd231ss_fma(ZEXT416((uint)(auVar72._0_4_ * auVar78._0_4_)),auVar80,auVar70);
      auVar79 = vdivss_avx512f(auVar69,ZEXT416((uint)fVar205));
      auVar80 = vsubps_avx(auVar85,auVar82);
      auVar123 = auVar236._0_16_;
      auVar70 = vmulps_avx512vl(auVar80,auVar123);
      auVar80 = vsubps_avx(auVar75,auVar85);
      auVar71 = vmulps_avx512vl(auVar80,auVar123);
      auVar80 = vsubps_avx(auVar76,auVar75);
      auVar80 = vmulps_avx512vl(auVar80,auVar123);
      auVar72 = vminps_avx(auVar71,auVar80);
      auVar80 = vmaxps_avx(auVar71,auVar80);
      auVar72 = vminps_avx(auVar70,auVar72);
      auVar80 = vmaxps_avx(auVar70,auVar80);
      auVar70 = vshufpd_avx(auVar72,auVar72,3);
      auVar71 = vshufpd_avx(auVar80,auVar80,3);
      auVar72 = vminps_avx(auVar72,auVar70);
      auVar80 = vmaxps_avx(auVar80,auVar71);
      fVar205 = auVar79._0_4_;
      auVar182._0_4_ = auVar72._0_4_ * fVar205;
      auVar182._4_4_ = auVar72._4_4_ * fVar205;
      auVar182._8_4_ = auVar72._8_4_ * fVar205;
      auVar182._12_4_ = auVar72._12_4_ * fVar205;
      auVar174._0_4_ = fVar205 * auVar80._0_4_;
      auVar174._4_4_ = fVar205 * auVar80._4_4_;
      auVar174._8_4_ = fVar205 * auVar80._8_4_;
      auVar174._12_4_ = fVar205 * auVar80._12_4_;
      auVar79 = vdivss_avx512f(auVar69,ZEXT416((uint)(auVar73._0_4_ - auVar149._0_4_)));
      auVar80 = vshufpd_avx(auVar82,auVar82,3);
      auVar72 = vshufpd_avx(auVar85,auVar85,3);
      auVar70 = vshufpd_avx(auVar75,auVar75,3);
      auVar71 = vshufpd_avx(auVar76,auVar76,3);
      auVar80 = vsubps_avx(auVar80,auVar82);
      auVar82 = vsubps_avx(auVar72,auVar85);
      auVar85 = vsubps_avx(auVar70,auVar75);
      auVar71 = vsubps_avx(auVar71,auVar76);
      auVar72 = vminps_avx(auVar80,auVar82);
      auVar80 = vmaxps_avx(auVar80,auVar82);
      auVar70 = vminps_avx(auVar85,auVar71);
      auVar70 = vminps_avx(auVar72,auVar70);
      auVar72 = vmaxps_avx(auVar85,auVar71);
      auVar80 = vmaxps_avx(auVar80,auVar72);
      fVar205 = auVar79._0_4_;
      auVar209._0_4_ = fVar205 * auVar70._0_4_;
      auVar209._4_4_ = fVar205 * auVar70._4_4_;
      auVar209._8_4_ = fVar205 * auVar70._8_4_;
      auVar209._12_4_ = fVar205 * auVar70._12_4_;
      auVar198._0_4_ = fVar205 * auVar80._0_4_;
      auVar198._4_4_ = fVar205 * auVar80._4_4_;
      auVar198._8_4_ = fVar205 * auVar80._8_4_;
      auVar198._12_4_ = fVar205 * auVar80._12_4_;
      auVar71 = vinsertps_avx(auVar58,auVar149,0x10);
      auVar74 = vpermt2ps_avx512vl(auVar58,_DAT_01fb9f90,auVar73);
      auVar131._0_4_ = auVar71._0_4_ + auVar74._0_4_;
      auVar131._4_4_ = auVar71._4_4_ + auVar74._4_4_;
      auVar131._8_4_ = auVar71._8_4_ + auVar74._8_4_;
      auVar131._12_4_ = auVar71._12_4_ + auVar74._12_4_;
      auVar16._8_4_ = 0x3f000000;
      auVar16._0_8_ = 0x3f0000003f000000;
      auVar16._12_4_ = 0x3f000000;
      auVar79 = vmulps_avx512vl(auVar131,auVar16);
      auVar72 = vshufps_avx(auVar79,auVar79,0x54);
      uVar129 = auVar79._0_4_;
      auVar134._4_4_ = uVar129;
      auVar134._0_4_ = uVar129;
      auVar134._8_4_ = uVar129;
      auVar134._12_4_ = uVar129;
      auVar70 = vfmadd213ps_fma(auVar39,auVar134,auVar46);
      auVar82 = vfmadd213ps_fma(auVar62,auVar134,auVar45);
      auVar85 = vfmadd213ps_fma(auVar63,auVar134,auVar42);
      auVar80 = vsubps_avx(auVar82,auVar70);
      auVar70 = vfmadd213ps_fma(auVar80,auVar134,auVar70);
      auVar80 = vsubps_avx(auVar85,auVar82);
      auVar80 = vfmadd213ps_fma(auVar80,auVar134,auVar82);
      auVar80 = vsubps_avx(auVar80,auVar70);
      auVar70 = vfmadd231ps_fma(auVar70,auVar80,auVar134);
      auVar75 = vmulps_avx512vl(auVar80,auVar123);
      auVar219._8_8_ = auVar70._0_8_;
      auVar219._0_8_ = auVar70._0_8_;
      auVar80 = vshufpd_avx(auVar70,auVar70,3);
      auVar70 = vshufps_avx(auVar79,auVar79,0x55);
      auVar82 = vsubps_avx(auVar80,auVar219);
      auVar85 = vfmadd231ps_fma(auVar219,auVar70,auVar82);
      auVar232._8_8_ = auVar75._0_8_;
      auVar232._0_8_ = auVar75._0_8_;
      auVar80 = vshufpd_avx(auVar75,auVar75,3);
      auVar80 = vsubps_avx512vl(auVar80,auVar232);
      auVar80 = vfmadd213ps_avx512vl(auVar80,auVar70,auVar232);
      auVar135._0_8_ = auVar82._0_8_ ^ 0x8000000080000000;
      auVar135._8_4_ = auVar82._8_4_ ^ 0x80000000;
      auVar135._12_4_ = auVar82._12_4_ ^ 0x80000000;
      auVar70 = vmovshdup_avx512vl(auVar80);
      auVar233._0_8_ = auVar70._0_8_ ^ 0x8000000080000000;
      auVar233._8_4_ = auVar70._8_4_ ^ 0x80000000;
      auVar233._12_4_ = auVar70._12_4_ ^ 0x80000000;
      auVar75 = vmovshdup_avx512vl(auVar82);
      auVar76 = vpermt2ps_avx512vl(auVar233,ZEXT416(5),auVar82);
      auVar81 = vxorps_avx512vl(ZEXT416(5),ZEXT416(5));
      auVar244 = ZEXT1664(auVar81);
      auVar70 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar70._0_4_ * auVar82._0_4_)),auVar80,auVar75);
      auVar82 = vpermt2ps_avx512vl(auVar80,SUB6416(ZEXT464(4),0),auVar135);
      auVar159._0_4_ = auVar70._0_4_;
      auVar159._4_4_ = auVar159._0_4_;
      auVar159._8_4_ = auVar159._0_4_;
      auVar159._12_4_ = auVar159._0_4_;
      auVar80 = vdivps_avx(auVar76,auVar159);
      auVar83 = vdivps_avx512vl(auVar82,auVar159);
      fVar205 = auVar85._0_4_;
      auVar70 = vshufps_avx(auVar85,auVar85,0x55);
      auVar220._0_4_ = fVar205 * auVar80._0_4_ + auVar70._0_4_ * auVar83._0_4_;
      auVar220._4_4_ = fVar205 * auVar80._4_4_ + auVar70._4_4_ * auVar83._4_4_;
      auVar220._8_4_ = fVar205 * auVar80._8_4_ + auVar70._8_4_ * auVar83._8_4_;
      auVar220._12_4_ = fVar205 * auVar80._12_4_ + auVar70._12_4_ * auVar83._12_4_;
      auVar77 = vsubps_avx(auVar72,auVar220);
      auVar70 = vmovshdup_avx(auVar80);
      auVar72 = vinsertps_avx(auVar182,auVar209,0x1c);
      auVar234._0_4_ = auVar70._0_4_ * auVar72._0_4_;
      auVar234._4_4_ = auVar70._4_4_ * auVar72._4_4_;
      auVar234._8_4_ = auVar70._8_4_ * auVar72._8_4_;
      auVar234._12_4_ = auVar70._12_4_ * auVar72._12_4_;
      auVar78 = vinsertps_avx512f(auVar174,auVar198,0x1c);
      auVar70 = vmulps_avx512vl(auVar70,auVar78);
      auVar76 = vminps_avx512vl(auVar234,auVar70);
      auVar85 = vmaxps_avx(auVar70,auVar234);
      auVar75 = vmovshdup_avx(auVar83);
      auVar70 = vinsertps_avx(auVar209,auVar182,0x4c);
      auVar210._0_4_ = auVar75._0_4_ * auVar70._0_4_;
      auVar210._4_4_ = auVar75._4_4_ * auVar70._4_4_;
      auVar210._8_4_ = auVar75._8_4_ * auVar70._8_4_;
      auVar210._12_4_ = auVar75._12_4_ * auVar70._12_4_;
      auVar82 = vinsertps_avx(auVar198,auVar174,0x4c);
      auVar199._0_4_ = auVar75._0_4_ * auVar82._0_4_;
      auVar199._4_4_ = auVar75._4_4_ * auVar82._4_4_;
      auVar199._8_4_ = auVar75._8_4_ * auVar82._8_4_;
      auVar199._12_4_ = auVar75._12_4_ * auVar82._12_4_;
      auVar75 = vminps_avx(auVar210,auVar199);
      auVar76 = vaddps_avx512vl(auVar76,auVar75);
      auVar75 = vmaxps_avx(auVar199,auVar210);
      auVar200._0_4_ = auVar85._0_4_ + auVar75._0_4_;
      auVar200._4_4_ = auVar85._4_4_ + auVar75._4_4_;
      auVar200._8_4_ = auVar85._8_4_ + auVar75._8_4_;
      auVar200._12_4_ = auVar85._12_4_ + auVar75._12_4_;
      auVar211._8_8_ = 0x3f80000000000000;
      auVar211._0_8_ = 0x3f80000000000000;
      auVar85 = vsubps_avx(auVar211,auVar200);
      auVar75 = vsubps_avx(auVar211,auVar76);
      auVar76 = vsubps_avx(auVar71,auVar79);
      auVar79 = vsubps_avx(auVar74,auVar79);
      fVar214 = auVar76._0_4_;
      auVar235._0_4_ = fVar214 * auVar85._0_4_;
      fVar215 = auVar76._4_4_;
      auVar235._4_4_ = fVar215 * auVar85._4_4_;
      fVar216 = auVar76._8_4_;
      auVar235._8_4_ = fVar216 * auVar85._8_4_;
      fVar217 = auVar76._12_4_;
      auVar235._12_4_ = fVar217 * auVar85._12_4_;
      auVar84 = vbroadcastss_avx512vl(auVar80);
      auVar72 = vmulps_avx512vl(auVar84,auVar72);
      auVar78 = vmulps_avx512vl(auVar84,auVar78);
      auVar84 = vminps_avx512vl(auVar72,auVar78);
      auVar78 = vmaxps_avx512vl(auVar78,auVar72);
      auVar72 = vbroadcastss_avx512vl(auVar83);
      auVar70 = vmulps_avx512vl(auVar72,auVar70);
      auVar72 = vmulps_avx512vl(auVar72,auVar82);
      auVar82 = vminps_avx512vl(auVar70,auVar72);
      auVar82 = vaddps_avx512vl(auVar84,auVar82);
      auVar76 = vmulps_avx512vl(auVar76,auVar75);
      fVar205 = auVar79._0_4_;
      auVar201._0_4_ = fVar205 * auVar85._0_4_;
      fVar195 = auVar79._4_4_;
      auVar201._4_4_ = fVar195 * auVar85._4_4_;
      fVar203 = auVar79._8_4_;
      auVar201._8_4_ = fVar203 * auVar85._8_4_;
      fVar204 = auVar79._12_4_;
      auVar201._12_4_ = fVar204 * auVar85._12_4_;
      auVar212._0_4_ = fVar205 * auVar75._0_4_;
      auVar212._4_4_ = fVar195 * auVar75._4_4_;
      auVar212._8_4_ = fVar203 * auVar75._8_4_;
      auVar212._12_4_ = fVar204 * auVar75._12_4_;
      auVar72 = vmaxps_avx(auVar72,auVar70);
      auVar175._0_4_ = auVar78._0_4_ + auVar72._0_4_;
      auVar175._4_4_ = auVar78._4_4_ + auVar72._4_4_;
      auVar175._8_4_ = auVar78._8_4_ + auVar72._8_4_;
      auVar175._12_4_ = auVar78._12_4_ + auVar72._12_4_;
      auVar183._8_8_ = 0x3f800000;
      auVar183._0_8_ = 0x3f800000;
      auVar72 = vsubps_avx(auVar183,auVar175);
      auVar70 = vsubps_avx512vl(auVar183,auVar82);
      auVar228._0_4_ = fVar214 * auVar72._0_4_;
      auVar228._4_4_ = fVar215 * auVar72._4_4_;
      auVar228._8_4_ = fVar216 * auVar72._8_4_;
      auVar228._12_4_ = fVar217 * auVar72._12_4_;
      auVar221._0_4_ = fVar214 * auVar70._0_4_;
      auVar221._4_4_ = fVar215 * auVar70._4_4_;
      auVar221._8_4_ = fVar216 * auVar70._8_4_;
      auVar221._12_4_ = fVar217 * auVar70._12_4_;
      auVar176._0_4_ = fVar205 * auVar72._0_4_;
      auVar176._4_4_ = fVar195 * auVar72._4_4_;
      auVar176._8_4_ = fVar203 * auVar72._8_4_;
      auVar176._12_4_ = fVar204 * auVar72._12_4_;
      auVar184._0_4_ = fVar205 * auVar70._0_4_;
      auVar184._4_4_ = fVar195 * auVar70._4_4_;
      auVar184._8_4_ = fVar203 * auVar70._8_4_;
      auVar184._12_4_ = fVar204 * auVar70._12_4_;
      auVar72 = vminps_avx(auVar228,auVar221);
      auVar70 = vminps_avx512vl(auVar176,auVar184);
      auVar82 = vminps_avx512vl(auVar72,auVar70);
      auVar72 = vmaxps_avx(auVar221,auVar228);
      auVar70 = vmaxps_avx(auVar184,auVar176);
      auVar70 = vmaxps_avx(auVar70,auVar72);
      auVar85 = vminps_avx512vl(auVar235,auVar76);
      auVar72 = vminps_avx(auVar201,auVar212);
      auVar72 = vminps_avx(auVar85,auVar72);
      auVar72 = vhaddps_avx(auVar82,auVar72);
      auVar85 = vmaxps_avx512vl(auVar76,auVar235);
      auVar82 = vmaxps_avx(auVar212,auVar201);
      auVar82 = vmaxps_avx(auVar82,auVar85);
      auVar70 = vhaddps_avx(auVar70,auVar82);
      auVar72 = vshufps_avx(auVar72,auVar72,0xe8);
      auVar70 = vshufps_avx(auVar70,auVar70,0xe8);
      auVar177._0_4_ = auVar72._0_4_ + auVar77._0_4_;
      auVar177._4_4_ = auVar72._4_4_ + auVar77._4_4_;
      auVar177._8_4_ = auVar72._8_4_ + auVar77._8_4_;
      auVar177._12_4_ = auVar72._12_4_ + auVar77._12_4_;
      auVar185._0_4_ = auVar70._0_4_ + auVar77._0_4_;
      auVar185._4_4_ = auVar70._4_4_ + auVar77._4_4_;
      auVar185._8_4_ = auVar70._8_4_ + auVar77._8_4_;
      auVar185._12_4_ = auVar70._12_4_ + auVar77._12_4_;
      auVar72 = vmaxps_avx(auVar71,auVar177);
      auVar70 = vminps_avx(auVar185,auVar74);
      uVar34 = vcmpps_avx512vl(auVar70,auVar72,1);
    } while ((uVar34 & 3) != 0);
    uVar34 = vcmpps_avx512vl(auVar185,auVar74,1);
    uVar14 = vcmpps_avx512vl(auVar58,auVar177,1);
    if (((ushort)uVar14 & (ushort)uVar34 & 1) == 0) {
      bVar27 = 0;
    }
    else {
      auVar72 = vmovshdup_avx(auVar177);
      bVar27 = auVar149._0_4_ < auVar72._0_4_ & (byte)(uVar34 >> 1) & 0x7f;
    }
    p03.field_0.i[0] = auVar41._0_4_;
    p03.field_0.i[1] = auVar41._4_4_;
    p03.field_0.i[2] = auVar41._8_4_;
    p03.field_0.i[3] = auVar41._12_4_;
    if (((3 < (uint)uVar29 || uVar8 != 0 && !bVar37) | bVar27) == 1) {
      lVar30 = 0xc9;
      do {
        lVar30 = lVar30 + -1;
        if (lVar30 == 0) goto LAB_019c2caa;
        auVar58 = vsubss_avx512f(auVar69,auVar77);
        fVar203 = auVar58._0_4_;
        fVar205 = fVar203 * fVar203 * fVar203;
        fVar204 = auVar77._0_4_;
        fVar195 = fVar204 * 3.0 * fVar203 * fVar203;
        fVar203 = fVar203 * fVar204 * fVar204 * 3.0;
        auVar150._4_4_ = fVar205;
        auVar150._0_4_ = fVar205;
        auVar150._8_4_ = fVar205;
        auVar150._12_4_ = fVar205;
        auVar143._4_4_ = fVar195;
        auVar143._0_4_ = fVar195;
        auVar143._8_4_ = fVar195;
        auVar143._12_4_ = fVar195;
        auVar124._4_4_ = fVar203;
        auVar124._0_4_ = fVar203;
        auVar124._8_4_ = fVar203;
        auVar124._12_4_ = fVar203;
        fVar204 = fVar204 * fVar204 * fVar204;
        auVar166._0_4_ = p03.field_0.v[0] * fVar204;
        auVar166._4_4_ = p03.field_0.v[1] * fVar204;
        auVar166._8_4_ = p03.field_0.v[2] * fVar204;
        auVar166._12_4_ = p03.field_0.v[3] * fVar204;
        auVar58 = vfmadd231ps_fma(auVar166,auVar42,auVar124);
        auVar58 = vfmadd231ps_fma(auVar58,auVar45,auVar143);
        auVar58 = vfmadd231ps_fma(auVar58,auVar46,auVar150);
        auVar125._8_8_ = auVar58._0_8_;
        auVar125._0_8_ = auVar58._0_8_;
        auVar58 = vshufpd_avx(auVar58,auVar58,3);
        auVar72 = vshufps_avx(auVar77,auVar77,0x55);
        auVar58 = vsubps_avx(auVar58,auVar125);
        auVar72 = vfmadd213ps_fma(auVar58,auVar72,auVar125);
        fVar205 = auVar72._0_4_;
        auVar58 = vshufps_avx(auVar72,auVar72,0x55);
        auVar126._0_4_ = auVar80._0_4_ * fVar205 + auVar83._0_4_ * auVar58._0_4_;
        auVar126._4_4_ = auVar80._4_4_ * fVar205 + auVar83._4_4_ * auVar58._4_4_;
        auVar126._8_4_ = auVar80._8_4_ * fVar205 + auVar83._8_4_ * auVar58._8_4_;
        auVar126._12_4_ = auVar80._12_4_ * fVar205 + auVar83._12_4_ * auVar58._12_4_;
        auVar77 = vsubps_avx(auVar77,auVar126);
        auVar58 = vandps_avx512vl(auVar72,auVar237._0_16_);
        auVar72 = vprolq_avx512vl(auVar58,0x20);
        auVar58 = vmaxss_avx(auVar72,auVar58);
        bVar37 = auVar58._0_4_ <= fVar122;
      } while (fVar122 <= auVar58._0_4_);
      auVar58 = vucomiss_avx512f(auVar81);
      if (bVar37) {
        auVar80 = vucomiss_avx512f(auVar58);
        auVar245 = ZEXT1664(auVar80);
        if (bVar37) {
          vmovshdup_avx(auVar58);
          auVar80 = vucomiss_avx512f(auVar81);
          if (bVar37) {
            auVar72 = vucomiss_avx512f(auVar80);
            auVar245 = ZEXT1664(auVar72);
            if (bVar37) {
              auVar69 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                      ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
              auVar79 = vinsertps_avx(auVar69,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                      0x28);
              auVar69 = vdpps_avx(auVar79,auVar44,0x7f);
              auVar70 = vdpps_avx(auVar79,auVar53,0x7f);
              auVar71 = vdpps_avx(auVar79,auVar54,0x7f);
              auVar82 = vdpps_avx(auVar79,auVar55,0x7f);
              auVar85 = vdpps_avx(auVar79,auVar43,0x7f);
              auVar75 = vdpps_avx(auVar79,auVar56,0x7f);
              auVar76 = vdpps_avx(auVar79,auVar57,0x7f);
              auVar79 = vdpps_avx(auVar79,auVar40,0x7f);
              auVar77 = vsubss_avx512f(auVar72,auVar80);
              fVar204 = auVar80._0_4_;
              auVar80 = vfmadd231ss_fma(ZEXT416((uint)(fVar204 * auVar85._0_4_)),auVar77,auVar69);
              auVar69 = vfmadd231ss_fma(ZEXT416((uint)(auVar75._0_4_ * fVar204)),auVar77,auVar70);
              auVar70 = vfmadd231ss_fma(ZEXT416((uint)(auVar76._0_4_ * fVar204)),auVar77,auVar71);
              auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar204 * auVar79._0_4_)),auVar77,auVar82);
              auVar72 = vsubss_avx512f(auVar72,auVar58);
              auVar186._0_4_ = auVar72._0_4_;
              fVar205 = auVar186._0_4_ * auVar186._0_4_ * auVar186._0_4_;
              local_d8 = auVar58._0_4_;
              fVar195 = local_d8 * 3.0 * auVar186._0_4_ * auVar186._0_4_;
              fVar203 = auVar186._0_4_ * local_d8 * local_d8 * 3.0;
              fVar215 = local_d8 * local_d8 * local_d8;
              auVar72 = vfmadd231ss_fma(ZEXT416((uint)(fVar215 * auVar71._0_4_)),
                                        ZEXT416((uint)fVar203),auVar70);
              auVar72 = vfmadd231ss_fma(auVar72,ZEXT416((uint)fVar195),auVar69);
              auVar80 = vfmadd231ss_fma(auVar72,ZEXT416((uint)fVar205),auVar80);
              fVar214 = auVar80._0_4_;
              if ((fVar1 <= fVar214) &&
                 (fVar216 = *(float *)(ray + k * 4 + 0x80), fVar214 <= fVar216)) {
                local_c8 = vshufps_avx(auVar58,auVar58,0x55);
                auVar86 = vsubps_avx512vl(auVar86,local_c8);
                fVar217 = local_c8._0_4_;
                auVar189._0_4_ = fVar217 * auVar230._0_4_;
                fVar224 = local_c8._4_4_;
                auVar189._4_4_ = fVar224 * auVar230._4_4_;
                fVar225 = local_c8._8_4_;
                auVar189._8_4_ = fVar225 * auVar230._8_4_;
                fVar226 = local_c8._12_4_;
                auVar189._12_4_ = fVar226 * auVar230._12_4_;
                local_288 = auVar51._0_4_;
                fStack_284 = auVar51._4_4_;
                fStack_280 = auVar51._8_4_;
                fStack_27c = auVar51._12_4_;
                auVar202._0_4_ = fVar217 * local_288;
                auVar202._4_4_ = fVar224 * fStack_284;
                auVar202._8_4_ = fVar225 * fStack_280;
                auVar202._12_4_ = fVar226 * fStack_27c;
                local_298 = auVar52._0_4_;
                fStack_294 = auVar52._4_4_;
                fStack_290 = auVar52._8_4_;
                fStack_28c = auVar52._12_4_;
                auVar213._0_4_ = fVar217 * local_298;
                auVar213._4_4_ = fVar224 * fStack_294;
                auVar213._8_4_ = fVar225 * fStack_290;
                auVar213._12_4_ = fVar226 * fStack_28c;
                auVar222._0_4_ = fVar217 * auVar218._0_4_;
                auVar222._4_4_ = fVar224 * auVar218._4_4_;
                auVar222._8_4_ = fVar225 * auVar218._8_4_;
                auVar222._12_4_ = fVar226 * auVar218._12_4_;
                auVar58 = vfmadd231ps_fma(auVar189,auVar86,auVar5);
                auVar80 = vfmadd231ps_fma(auVar202,auVar86,auVar49);
                auVar72 = vfmadd231ps_fma(auVar213,auVar86,auVar50);
                auVar86 = vfmadd231ps_fma(auVar222,auVar86,auVar48);
                auVar58 = vsubps_avx(auVar80,auVar58);
                auVar80 = vsubps_avx(auVar72,auVar80);
                auVar72 = vsubps_avx(auVar86,auVar72);
                auVar223._0_4_ = local_d8 * auVar80._0_4_;
                auVar223._4_4_ = local_d8 * auVar80._4_4_;
                auVar223._8_4_ = local_d8 * auVar80._8_4_;
                auVar223._12_4_ = local_d8 * auVar80._12_4_;
                auVar186._4_4_ = auVar186._0_4_;
                auVar186._8_4_ = auVar186._0_4_;
                auVar186._12_4_ = auVar186._0_4_;
                auVar58 = vfmadd231ps_fma(auVar223,auVar186,auVar58);
                auVar190._0_4_ = local_d8 * auVar72._0_4_;
                auVar190._4_4_ = local_d8 * auVar72._4_4_;
                auVar190._8_4_ = local_d8 * auVar72._8_4_;
                auVar190._12_4_ = local_d8 * auVar72._12_4_;
                auVar80 = vfmadd231ps_fma(auVar190,auVar186,auVar80);
                auVar191._0_4_ = local_d8 * auVar80._0_4_;
                auVar191._4_4_ = local_d8 * auVar80._4_4_;
                auVar191._8_4_ = local_d8 * auVar80._8_4_;
                auVar191._12_4_ = local_d8 * auVar80._12_4_;
                auVar58 = vfmadd231ps_fma(auVar191,auVar186,auVar58);
                auVar58 = vmulps_avx512vl(auVar58,auVar123);
                pGVar9 = (context->scene->geometries).items[uVar6].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  local_2d8 = auVar66._0_4_;
                  fStack_2d4 = auVar66._4_4_;
                  fStack_2d0 = auVar66._8_4_;
                  fStack_2cc = auVar66._12_4_;
                  auVar172._0_4_ = fVar215 * local_2d8;
                  auVar172._4_4_ = fVar215 * fStack_2d4;
                  auVar172._8_4_ = fVar215 * fStack_2d0;
                  auVar172._12_4_ = fVar215 * fStack_2cc;
                  auVar167._4_4_ = fVar203;
                  auVar167._0_4_ = fVar203;
                  auVar167._8_4_ = fVar203;
                  auVar167._12_4_ = fVar203;
                  auVar80 = vfmadd132ps_fma(auVar167,auVar172,auVar65);
                  auVar160._4_4_ = fVar195;
                  auVar160._0_4_ = fVar195;
                  auVar160._8_4_ = fVar195;
                  auVar160._12_4_ = fVar195;
                  auVar80 = vfmadd132ps_fma(auVar160,auVar80,auVar64);
                  auVar144._4_4_ = fVar205;
                  auVar144._0_4_ = fVar205;
                  auVar144._8_4_ = fVar205;
                  auVar144._12_4_ = fVar205;
                  auVar86 = vfmadd132ps_fma(auVar144,auVar80,auVar47);
                  auVar80 = vshufps_avx(auVar86,auVar86,0xc9);
                  auVar72 = vshufps_avx(auVar58,auVar58,0xc9);
                  auVar145._0_4_ = auVar86._0_4_ * auVar72._0_4_;
                  auVar145._4_4_ = auVar86._4_4_ * auVar72._4_4_;
                  auVar145._8_4_ = auVar86._8_4_ * auVar72._8_4_;
                  auVar145._12_4_ = auVar86._12_4_ * auVar72._12_4_;
                  auVar58 = vfmsub231ps_fma(auVar145,auVar58,auVar80);
                  local_e8 = auVar58._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x80) = fVar214;
                    uVar129 = vextractps_avx(auVar58,1);
                    *(undefined4 *)(ray + k * 4 + 0xc0) = uVar129;
                    uVar129 = vextractps_avx(auVar58,2);
                    *(undefined4 *)(ray + k * 4 + 0xd0) = uVar129;
                    *(undefined4 *)(ray + k * 4 + 0xe0) = local_e8;
                    *(float *)(ray + k * 4 + 0xf0) = local_d8;
                    *(float *)(ray + k * 4 + 0x100) = fVar204;
                    *(uint *)(ray + k * 4 + 0x110) = uVar7;
                    *(uint *)(ray + k * 4 + 0x120) = uVar6;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    goto LAB_019c2caa;
                  }
                  auVar80 = vshufps_avx(auVar58,auVar58,0x55);
                  local_f8 = vshufps_avx(auVar58,auVar58,0xaa);
                  local_108[0] = (RTCHitN)auVar80[0];
                  local_108[1] = (RTCHitN)auVar80[1];
                  local_108[2] = (RTCHitN)auVar80[2];
                  local_108[3] = (RTCHitN)auVar80[3];
                  local_108[4] = (RTCHitN)auVar80[4];
                  local_108[5] = (RTCHitN)auVar80[5];
                  local_108[6] = (RTCHitN)auVar80[6];
                  local_108[7] = (RTCHitN)auVar80[7];
                  local_108[8] = (RTCHitN)auVar80[8];
                  local_108[9] = (RTCHitN)auVar80[9];
                  local_108[10] = (RTCHitN)auVar80[10];
                  local_108[0xb] = (RTCHitN)auVar80[0xb];
                  local_108[0xc] = (RTCHitN)auVar80[0xc];
                  local_108[0xd] = (RTCHitN)auVar80[0xd];
                  local_108[0xe] = (RTCHitN)auVar80[0xe];
                  local_108[0xf] = (RTCHitN)auVar80[0xf];
                  uStack_e4 = local_e8;
                  uStack_e0 = local_e8;
                  uStack_dc = local_e8;
                  fStack_d4 = local_d8;
                  fStack_d0 = local_d8;
                  fStack_cc = local_d8;
                  local_2f8 = auVar68._0_8_;
                  uStack_2f0 = auVar68._8_8_;
                  local_b8 = local_2f8;
                  uStack_b0 = uStack_2f0;
                  local_a8 = auVar67;
                  vpcmpeqd_avx2(ZEXT1632(auVar67),ZEXT1632(auVar67));
                  uStack_94 = context->user->instID[0];
                  local_98 = uStack_94;
                  uStack_90 = uStack_94;
                  uStack_8c = uStack_94;
                  uStack_88 = context->user->instPrimID[0];
                  uStack_84 = uStack_88;
                  uStack_80 = uStack_88;
                  uStack_7c = uStack_88;
                  *(float *)(ray + k * 4 + 0x80) = fVar214;
                  args.valid = (int *)local_358;
                  args.geometryUserPtr = pGVar9->userPtr;
                  args.context = context->user;
                  args.hit = local_108;
                  args.N = 4;
                  local_358 = auVar13;
                  args.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar9->intersectionFilterN)(&args);
                    auVar58 = vxorps_avx512vl(auVar81,auVar81);
                    auVar244 = ZEXT1664(auVar58);
                    auVar245 = ZEXT464(0x3f800000);
                    auVar242 = ZEXT3264(_DAT_01fb9fe0);
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar241 = ZEXT1664(auVar58);
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                    auVar240 = ZEXT1664(auVar58);
                    auVar92 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar239 = ZEXT3264(auVar92);
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                    auVar238 = ZEXT1664(auVar58);
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar237 = ZEXT1664(auVar58);
                    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                    auVar236 = ZEXT1664(auVar58);
                    auVar92 = vbroadcastss_avx512vl(ZEXT416(2));
                    auVar243 = ZEXT3264(auVar92);
                  }
                  auVar58 = auVar244._0_16_;
                  uVar34 = vptestmd_avx512vl(local_358,local_358);
                  if ((uVar34 & 0xf) != 0) {
                    p_Var10 = context->args->filter;
                    if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var10)(&args);
                      auVar58 = vxorps_avx512vl(auVar58,auVar58);
                      auVar244 = ZEXT1664(auVar58);
                      auVar245 = ZEXT464(0x3f800000);
                      auVar242 = ZEXT3264(_DAT_01fb9fe0);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar241 = ZEXT1664(auVar58);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x3e124925));
                      auVar240 = ZEXT1664(auVar58);
                      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar239 = ZEXT3264(auVar92);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar238 = ZEXT1664(auVar58);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar237 = ZEXT1664(auVar58);
                      auVar58 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                      auVar236 = ZEXT1664(auVar58);
                      auVar92 = vbroadcastss_avx512vl(ZEXT416(2));
                      auVar243 = ZEXT3264(auVar92);
                    }
                    uVar34 = vptestmd_avx512vl(local_358,local_358);
                    uVar34 = uVar34 & 0xf;
                    bVar27 = (byte)uVar34;
                    if (bVar27 != 0) {
                      iVar24 = *(int *)(args.hit + 4);
                      iVar25 = *(int *)(args.hit + 8);
                      iVar26 = *(int *)(args.hit + 0xc);
                      bVar37 = (bool)((byte)(uVar34 >> 1) & 1);
                      bVar38 = (bool)((byte)(uVar34 >> 2) & 1);
                      bVar35 = SUB81(uVar34 >> 3,0);
                      *(uint *)(args.ray + 0xc0) =
                           (uint)(bVar27 & 1) * *(int *)args.hit |
                           (uint)!(bool)(bVar27 & 1) * *(uint *)(args.ray + 0xc0);
                      *(uint *)(args.ray + 0xc4) =
                           (uint)bVar37 * iVar24 | (uint)!bVar37 * *(int *)(args.ray + 0xc4);
                      *(uint *)(args.ray + 200) =
                           (uint)bVar38 * iVar25 | (uint)!bVar38 * *(int *)(args.ray + 200);
                      *(uint *)(args.ray + 0xcc) =
                           (uint)bVar35 * iVar26 | (uint)!bVar35 * *(int *)(args.ray + 0xcc);
                      iVar24 = *(int *)(args.hit + 0x14);
                      iVar25 = *(int *)(args.hit + 0x18);
                      iVar26 = *(int *)(args.hit + 0x1c);
                      bVar37 = (bool)((byte)(uVar34 >> 1) & 1);
                      bVar38 = (bool)((byte)(uVar34 >> 2) & 1);
                      bVar35 = SUB81(uVar34 >> 3,0);
                      *(uint *)(args.ray + 0xd0) =
                           (uint)(bVar27 & 1) * *(int *)(args.hit + 0x10) |
                           (uint)!(bool)(bVar27 & 1) * *(uint *)(args.ray + 0xd0);
                      *(uint *)(args.ray + 0xd4) =
                           (uint)bVar37 * iVar24 | (uint)!bVar37 * *(int *)(args.ray + 0xd4);
                      *(uint *)(args.ray + 0xd8) =
                           (uint)bVar38 * iVar25 | (uint)!bVar38 * *(int *)(args.ray + 0xd8);
                      *(uint *)(args.ray + 0xdc) =
                           (uint)bVar35 * iVar26 | (uint)!bVar35 * *(int *)(args.ray + 0xdc);
                      iVar24 = *(int *)(args.hit + 0x24);
                      iVar25 = *(int *)(args.hit + 0x28);
                      iVar26 = *(int *)(args.hit + 0x2c);
                      bVar37 = (bool)((byte)(uVar34 >> 1) & 1);
                      bVar38 = (bool)((byte)(uVar34 >> 2) & 1);
                      bVar35 = SUB81(uVar34 >> 3,0);
                      *(uint *)(args.ray + 0xe0) =
                           (uint)(bVar27 & 1) * *(int *)(args.hit + 0x20) |
                           (uint)!(bool)(bVar27 & 1) * *(uint *)(args.ray + 0xe0);
                      *(uint *)(args.ray + 0xe4) =
                           (uint)bVar37 * iVar24 | (uint)!bVar37 * *(int *)(args.ray + 0xe4);
                      *(uint *)(args.ray + 0xe8) =
                           (uint)bVar38 * iVar25 | (uint)!bVar38 * *(int *)(args.ray + 0xe8);
                      *(uint *)(args.ray + 0xec) =
                           (uint)bVar35 * iVar26 | (uint)!bVar35 * *(int *)(args.ray + 0xec);
                      iVar24 = *(int *)(args.hit + 0x34);
                      iVar25 = *(int *)(args.hit + 0x38);
                      iVar26 = *(int *)(args.hit + 0x3c);
                      bVar37 = (bool)((byte)(uVar34 >> 1) & 1);
                      bVar38 = (bool)((byte)(uVar34 >> 2) & 1);
                      bVar35 = SUB81(uVar34 >> 3,0);
                      *(uint *)(args.ray + 0xf0) =
                           (uint)(bVar27 & 1) * *(int *)(args.hit + 0x30) |
                           (uint)!(bool)(bVar27 & 1) * *(uint *)(args.ray + 0xf0);
                      *(uint *)(args.ray + 0xf4) =
                           (uint)bVar37 * iVar24 | (uint)!bVar37 * *(int *)(args.ray + 0xf4);
                      *(uint *)(args.ray + 0xf8) =
                           (uint)bVar38 * iVar25 | (uint)!bVar38 * *(int *)(args.ray + 0xf8);
                      *(uint *)(args.ray + 0xfc) =
                           (uint)bVar35 * iVar26 | (uint)!bVar35 * *(int *)(args.ray + 0xfc);
                      iVar24 = *(int *)(args.hit + 0x44);
                      iVar25 = *(int *)(args.hit + 0x48);
                      iVar26 = *(int *)(args.hit + 0x4c);
                      bVar37 = (bool)((byte)(uVar34 >> 1) & 1);
                      bVar38 = (bool)((byte)(uVar34 >> 2) & 1);
                      bVar35 = SUB81(uVar34 >> 3,0);
                      *(uint *)(args.ray + 0x100) =
                           (uint)(bVar27 & 1) * *(int *)(args.hit + 0x40) |
                           (uint)!(bool)(bVar27 & 1) * *(uint *)(args.ray + 0x100);
                      *(uint *)(args.ray + 0x104) =
                           (uint)bVar37 * iVar24 | (uint)!bVar37 * *(int *)(args.ray + 0x104);
                      *(uint *)(args.ray + 0x108) =
                           (uint)bVar38 * iVar25 | (uint)!bVar38 * *(int *)(args.ray + 0x108);
                      *(uint *)(args.ray + 0x10c) =
                           (uint)bVar35 * iVar26 | (uint)!bVar35 * *(int *)(args.ray + 0x10c);
                      auVar58 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x50));
                      *(undefined1 (*) [16])(args.ray + 0x110) = auVar58;
                      auVar58 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x60));
                      *(undefined1 (*) [16])(args.ray + 0x120) = auVar58;
                      auVar58 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x70));
                      *(undefined1 (*) [16])(args.ray + 0x130) = auVar58;
                      auVar58 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(args.hit + 0x80));
                      *(undefined1 (*) [16])(args.ray + 0x140) = auVar58;
                      goto LAB_019c2caa;
                    }
                  }
                  *(float *)(ray + k * 4 + 0x80) = fVar216;
                }
              }
            }
          }
        }
      }
      goto LAB_019c2caa;
    }
    auVar80 = vinsertps_avx(auVar149,auVar73,0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }